

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,16>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  int iVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  byte bVar61;
  ulong uVar62;
  Geometry *geometry;
  long lVar63;
  long lVar64;
  ulong uVar65;
  bool bVar66;
  ulong uVar67;
  undefined1 auVar68 [8];
  ulong uVar69;
  long lVar70;
  byte bVar71;
  float fVar72;
  float fVar132;
  float fVar134;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar73;
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar138;
  float fVar139;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined4 uVar140;
  vint4 bi_2;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [64];
  float fVar147;
  undefined8 uVar148;
  vint4 bi_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  vint4 bi;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar157;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 ai;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar170;
  float fVar171;
  float fVar173;
  vint4 ai_1;
  undefined1 auVar172 [16];
  vint4 ai_2;
  undefined1 auVar174 [32];
  float fVar175;
  uint uVar176;
  float fVar178;
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  RTCFilterFunctionNArguments local_890;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  LinearSpace3fa *local_750;
  Primitive *local_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_690 [8];
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  uint uStack_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  undefined1 local_640 [64];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  int local_57c;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar62 = (ulong)(byte)prim[1];
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xf + 6)));
  lVar70 = uVar62 * 0x25;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x11 + 6)));
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1a + 6)));
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1b + 6)));
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1c + 6)));
  uVar140 = *(undefined4 *)(prim + lVar70 + 0x12);
  auVar189._4_4_ = uVar140;
  auVar189._0_4_ = uVar140;
  auVar189._8_4_ = uVar140;
  auVar189._12_4_ = uVar140;
  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar74 = vsubps_avx512vl(auVar87,*(undefined1 (*) [16])(prim + lVar70 + 6));
  fVar157 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar70 + 0x16)) *
            *(float *)(prim + lVar70 + 0x1a);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar93 = vpmovsxwd_avx(auVar87);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar62 * 0xb + 6);
  auVar28 = vpmovsxwd_avx(auVar92);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar29 = vpmovsxwd_avx(auVar89);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar62 * 0xd + 6);
  auVar141 = vpmovsxwd_avx(auVar88);
  auVar75 = vpbroadcastd_avx512vl();
  auVar87 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar87 = vinsertps_avx512f(auVar87,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar74 = vmulps_avx512vl(auVar189,auVar74);
  auVar76 = vmulps_avx512vl(auVar189,auVar87);
  auVar77 = vcvtdq2ps_avx512vl(auVar27);
  auVar78 = vcvtdq2ps_avx512vl(auVar83);
  auVar79 = vcvtdq2ps_avx512vl(auVar79);
  auVar80 = vcvtdq2ps_avx512vl(auVar80);
  auVar81 = vcvtdq2ps_avx512vl(auVar81);
  auVar87 = vcvtdq2ps_avx(auVar82);
  auVar92 = vcvtdq2ps_avx(auVar84);
  auVar89 = vcvtdq2ps_avx(auVar85);
  auVar88 = vcvtdq2ps_avx(auVar86);
  uVar140 = auVar76._0_4_;
  auVar181._4_4_ = uVar140;
  auVar181._0_4_ = uVar140;
  auVar181._8_4_ = uVar140;
  auVar181._12_4_ = uVar140;
  auVar27 = vshufps_avx(auVar76,auVar76,0x55);
  auVar83 = vshufps_avx(auVar76,auVar76,0xaa);
  auVar82 = vmulps_avx512vl(auVar83,auVar79);
  auVar149._0_4_ = auVar83._0_4_ * auVar87._0_4_;
  auVar149._4_4_ = auVar83._4_4_ * auVar87._4_4_;
  auVar149._8_4_ = auVar83._8_4_ * auVar87._8_4_;
  auVar149._12_4_ = auVar83._12_4_ * auVar87._12_4_;
  auVar76._0_4_ = auVar88._0_4_ * auVar83._0_4_;
  auVar76._4_4_ = auVar88._4_4_ * auVar83._4_4_;
  auVar76._8_4_ = auVar88._8_4_ * auVar83._8_4_;
  auVar76._12_4_ = auVar88._12_4_ * auVar83._12_4_;
  auVar83 = vfmadd231ps_avx512vl(auVar82,auVar27,auVar78);
  auVar82 = vfmadd231ps_avx512vl(auVar149,auVar27,auVar81);
  auVar27 = vfmadd231ps_fma(auVar76,auVar89,auVar27);
  auVar83 = vfmadd231ps_avx512vl(auVar83,auVar181,auVar77);
  auVar82 = vfmadd231ps_avx512vl(auVar82,auVar181,auVar80);
  auVar27 = vfmadd231ps_fma(auVar27,auVar92,auVar181);
  auVar84 = vbroadcastss_avx512vl(auVar74);
  auVar85 = vshufps_avx512vl(auVar74,auVar74,0x55);
  auVar86 = vshufps_avx512vl(auVar74,auVar74,0xaa);
  auVar79 = vmulps_avx512vl(auVar86,auVar79);
  auVar87 = vmulps_avx512vl(auVar86,auVar87);
  auVar88 = vmulps_avx512vl(auVar86,auVar88);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar85,auVar78);
  auVar87 = vfmadd231ps_avx512vl(auVar87,auVar85,auVar81);
  auVar89 = vfmadd231ps_avx512vl(auVar88,auVar85,auVar89);
  auVar77 = vfmadd231ps_avx512vl(auVar79,auVar84,auVar77);
  auVar78 = vfmadd231ps_avx512vl(auVar87,auVar84,auVar80);
  auVar76 = vfmadd231ps_fma(auVar89,auVar84,auVar92);
  auVar188._8_4_ = 0x7fffffff;
  auVar188._0_8_ = 0x7fffffff7fffffff;
  auVar188._12_4_ = 0x7fffffff;
  auVar87 = vandps_avx(auVar188,auVar83);
  auVar185._8_4_ = 0x219392ef;
  auVar185._0_8_ = 0x219392ef219392ef;
  auVar185._12_4_ = 0x219392ef;
  uVar69 = vcmpps_avx512vl(auVar87,auVar185,1);
  bVar66 = (bool)((byte)uVar69 & 1);
  auVar74._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar83._0_4_;
  bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar83._4_4_;
  bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar83._8_4_;
  bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar83._12_4_;
  auVar87 = vandps_avx(auVar188,auVar82);
  uVar69 = vcmpps_avx512vl(auVar87,auVar185,1);
  bVar66 = (bool)((byte)uVar69 & 1);
  auVar90._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar82._0_4_;
  bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar82._4_4_;
  bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar82._8_4_;
  bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar82._12_4_;
  auVar87 = vandps_avx(auVar188,auVar27);
  uVar69 = vcmpps_avx512vl(auVar87,auVar185,1);
  bVar66 = (bool)((byte)uVar69 & 1);
  auVar91._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar27._0_4_;
  bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar27._4_4_;
  bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar27._8_4_;
  bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar27._12_4_;
  auVar92 = vrcp14ps_avx512vl(auVar74);
  auVar186._8_4_ = 0x3f800000;
  auVar186._0_8_ = 0x3f8000003f800000;
  auVar186._12_4_ = 0x3f800000;
  auVar87 = vfnmadd213ps_fma(auVar74,auVar92,auVar186);
  auVar88 = vfmadd132ps_fma(auVar87,auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar90);
  auVar87 = vfnmadd213ps_fma(auVar90,auVar92,auVar186);
  auVar86 = vfmadd132ps_fma(auVar87,auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar91);
  auVar87 = vfnmadd213ps_fma(auVar91,auVar92,auVar186);
  auVar74 = vfmadd132ps_fma(auVar87,auVar92,auVar92);
  auVar162._4_4_ = fVar157;
  auVar162._0_4_ = fVar157;
  auVar162._8_4_ = fVar157;
  auVar162._12_4_ = fVar157;
  auVar87 = vcvtdq2ps_avx(auVar93);
  auVar92 = vcvtdq2ps_avx(auVar28);
  auVar92 = vsubps_avx(auVar92,auVar87);
  auVar93 = vfmadd213ps_fma(auVar92,auVar162,auVar87);
  auVar87 = vcvtdq2ps_avx(auVar29);
  auVar92 = vcvtdq2ps_avx(auVar141);
  auVar92 = vsubps_avx(auVar92,auVar87);
  auVar28 = vfmadd213ps_fma(auVar92,auVar162,auVar87);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar62 * 0x12 + 6);
  auVar87 = vpmovsxwd_avx(auVar27);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar62 * 0x16 + 6);
  auVar92 = vpmovsxwd_avx(auVar83);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar87);
  auVar27 = vfmadd213ps_fma(auVar92,auVar162,auVar87);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar62 * 0x14 + 6);
  auVar87 = vpmovsxwd_avx(auVar79);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar62 * 0x18 + 6);
  auVar92 = vpmovsxwd_avx(auVar80);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar89 = vsubps_avx(auVar92,auVar87);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar62 * 0x1d + 6);
  auVar92 = vpmovsxwd_avx(auVar81);
  auVar89 = vfmadd213ps_fma(auVar89,auVar162,auVar87);
  auVar87 = vcvtdq2ps_avx(auVar92);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar62 * 0x21 + 6);
  auVar92 = vpmovsxwd_avx(auVar82);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar87);
  auVar83 = vfmadd213ps_fma(auVar92,auVar162,auVar87);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar62 * 0x1f + 6);
  auVar87 = vpmovsxwd_avx(auVar84);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar62 * 0x23 + 6);
  auVar92 = vpmovsxwd_avx(auVar85);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar87);
  auVar92 = vfmadd213ps_fma(auVar92,auVar162,auVar87);
  auVar87 = vsubps_avx(auVar93,auVar77);
  auVar163._0_4_ = auVar88._0_4_ * auVar87._0_4_;
  auVar163._4_4_ = auVar88._4_4_ * auVar87._4_4_;
  auVar163._8_4_ = auVar88._8_4_ * auVar87._8_4_;
  auVar163._12_4_ = auVar88._12_4_ * auVar87._12_4_;
  auVar87 = vsubps_avx(auVar28,auVar77);
  auVar153._0_4_ = auVar88._0_4_ * auVar87._0_4_;
  auVar153._4_4_ = auVar88._4_4_ * auVar87._4_4_;
  auVar153._8_4_ = auVar88._8_4_ * auVar87._8_4_;
  auVar153._12_4_ = auVar88._12_4_ * auVar87._12_4_;
  auVar87 = vsubps_avx(auVar27,auVar78);
  auVar172._0_4_ = auVar86._0_4_ * auVar87._0_4_;
  auVar172._4_4_ = auVar86._4_4_ * auVar87._4_4_;
  auVar172._8_4_ = auVar86._8_4_ * auVar87._8_4_;
  auVar172._12_4_ = auVar86._12_4_ * auVar87._12_4_;
  auVar87 = vsubps_avx(auVar89,auVar78);
  auVar77._0_4_ = auVar86._0_4_ * auVar87._0_4_;
  auVar77._4_4_ = auVar86._4_4_ * auVar87._4_4_;
  auVar77._8_4_ = auVar86._8_4_ * auVar87._8_4_;
  auVar77._12_4_ = auVar86._12_4_ * auVar87._12_4_;
  auVar87 = vsubps_avx(auVar83,auVar76);
  auVar78._0_4_ = auVar74._0_4_ * auVar87._0_4_;
  auVar78._4_4_ = auVar74._4_4_ * auVar87._4_4_;
  auVar78._8_4_ = auVar74._8_4_ * auVar87._8_4_;
  auVar78._12_4_ = auVar74._12_4_ * auVar87._12_4_;
  auVar87 = vsubps_avx(auVar92,auVar76);
  auVar141._0_4_ = auVar74._0_4_ * auVar87._0_4_;
  auVar141._4_4_ = auVar74._4_4_ * auVar87._4_4_;
  auVar141._8_4_ = auVar74._8_4_ * auVar87._8_4_;
  auVar141._12_4_ = auVar74._12_4_ * auVar87._12_4_;
  auVar87 = vpminsd_avx(auVar163,auVar153);
  auVar92 = vpminsd_avx(auVar172,auVar77);
  auVar87 = vmaxps_avx(auVar87,auVar92);
  auVar92 = vpminsd_avx(auVar78,auVar141);
  uVar140 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar86._4_4_ = uVar140;
  auVar86._0_4_ = uVar140;
  auVar86._8_4_ = uVar140;
  auVar86._12_4_ = uVar140;
  auVar92 = vmaxps_avx512vl(auVar92,auVar86);
  auVar87 = vmaxps_avx(auVar87,auVar92);
  auVar93._8_4_ = 0x3f7ffffa;
  auVar93._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar93._12_4_ = 0x3f7ffffa;
  local_5f0 = vmulps_avx512vl(auVar87,auVar93);
  auVar87 = vpmaxsd_avx(auVar163,auVar153);
  auVar92 = vpmaxsd_avx(auVar172,auVar77);
  auVar87 = vminps_avx(auVar87,auVar92);
  auVar92 = vpmaxsd_avx(auVar78,auVar141);
  uVar140 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar28._4_4_ = uVar140;
  auVar28._0_4_ = uVar140;
  auVar28._8_4_ = uVar140;
  auVar28._12_4_ = uVar140;
  auVar92 = vminps_avx512vl(auVar92,auVar28);
  auVar87 = vminps_avx(auVar87,auVar92);
  auVar29._8_4_ = 0x3f800003;
  auVar29._0_8_ = 0x3f8000033f800003;
  auVar29._12_4_ = 0x3f800003;
  auVar87 = vmulps_avx512vl(auVar87,auVar29);
  uVar148 = vcmpps_avx512vl(local_5f0,auVar87,2);
  uVar30 = vpcmpgtd_avx512vl(auVar75,_DAT_01f4ad30);
  uVar69 = (ulong)((byte)uVar148 & 0xf & (byte)uVar30);
  local_750 = pre->ray_space + k;
  auVar146 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_340 = vmovdqa64_avx512f(auVar146);
  local_748 = prim;
  for (; uVar69 != 0; uVar69 = (ulong)((uint)uVar69 & (uint)uVar69 + 0xf & (uint)uVar148)) {
    lVar70 = 0;
    for (uVar62 = uVar69; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
      lVar70 = lVar70 + 1;
    }
    uVar6 = *(uint *)(local_748 + 2);
    pGVar8 = (context->scene->geometries).items[uVar6].ptr;
    uVar62 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                             (ulong)*(uint *)(local_748 + lVar70 * 4 + 6) *
                             pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    fVar157 = (pGVar8->time_range).lower;
    fVar157 = pGVar8->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x1c0) - fVar157) / ((pGVar8->time_range).upper - fVar157))
    ;
    auVar87 = vroundss_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar157),9);
    auVar87 = vminss_avx(auVar87,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
    auVar87 = vmaxss_avx(ZEXT816(0) << 0x20,auVar87);
    fVar157 = fVar157 - auVar87._0_4_;
    _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar64 = (long)(int)auVar87._0_4_ * 0x38;
    lVar70 = *(long *)(_Var9 + 0x10 + lVar64);
    lVar63 = *(long *)(_Var9 + 0x38 + lVar64);
    lVar10 = *(long *)(_Var9 + 0x48 + lVar64);
    auVar150._4_4_ = fVar157;
    auVar150._0_4_ = fVar157;
    auVar150._8_4_ = fVar157;
    auVar150._12_4_ = fVar157;
    pfVar3 = (float *)(lVar63 + uVar62 * lVar10);
    auVar183._0_4_ = fVar157 * *pfVar3;
    auVar183._4_4_ = fVar157 * pfVar3[1];
    auVar183._8_4_ = fVar157 * pfVar3[2];
    auVar183._12_4_ = fVar157 * pfVar3[3];
    pfVar3 = (float *)(lVar63 + (uVar62 + 1) * lVar10);
    auVar184._0_4_ = fVar157 * *pfVar3;
    auVar184._4_4_ = fVar157 * pfVar3[1];
    auVar184._8_4_ = fVar157 * pfVar3[2];
    auVar184._12_4_ = fVar157 * pfVar3[3];
    auVar87 = vmulps_avx512vl(auVar150,*(undefined1 (*) [16])(lVar63 + (uVar62 + 2) * lVar10));
    auVar92 = vmulps_avx512vl(auVar150,*(undefined1 (*) [16])(lVar63 + lVar10 * (uVar62 + 3)));
    lVar63 = *(long *)(_Var9 + lVar64);
    fVar157 = 1.0 - fVar157;
    auVar75._4_4_ = fVar157;
    auVar75._0_4_ = fVar157;
    auVar75._8_4_ = fVar157;
    auVar75._12_4_ = fVar157;
    local_7f0 = vfmadd231ps_fma(auVar183,auVar75,*(undefined1 (*) [16])(lVar63 + lVar70 * uVar62));
    local_800 = vfmadd231ps_fma(auVar184,auVar75,
                                *(undefined1 (*) [16])(lVar63 + lVar70 * (uVar62 + 1)));
    local_810 = vfmadd231ps_avx512vl
                          (auVar87,auVar75,*(undefined1 (*) [16])(lVar63 + lVar70 * (uVar62 + 2)));
    _local_690 = vfmadd231ps_avx512vl
                           (auVar92,auVar75,*(undefined1 (*) [16])(lVar63 + lVar70 * (uVar62 + 3)));
    iVar7 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                            0x1c);
    auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
    auVar89 = vsubps_avx(local_7f0,auVar87);
    uVar140 = auVar89._0_4_;
    auVar154._4_4_ = uVar140;
    auVar154._0_4_ = uVar140;
    auVar154._8_4_ = uVar140;
    auVar154._12_4_ = uVar140;
    auVar92 = vshufps_avx(auVar89,auVar89,0x55);
    auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
    aVar4 = (local_750->vx).field_0;
    aVar5 = (local_750->vy).field_0;
    fVar157 = (local_750->vz).field_0.m128[0];
    fVar175 = *(float *)((long)&(local_750->vz).field_0 + 4);
    fVar178 = *(float *)((long)&(local_750->vz).field_0 + 8);
    fVar147 = *(float *)((long)&(local_750->vz).field_0 + 0xc);
    auVar177._0_4_ = fVar157 * auVar89._0_4_;
    auVar177._4_4_ = fVar175 * auVar89._4_4_;
    auVar177._8_4_ = fVar178 * auVar89._8_4_;
    auVar177._12_4_ = fVar147 * auVar89._12_4_;
    auVar92 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar5,auVar92);
    auVar88 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar4,auVar154);
    auVar89 = vsubps_avx(local_800,auVar87);
    uVar140 = auVar89._0_4_;
    auVar155._4_4_ = uVar140;
    auVar155._0_4_ = uVar140;
    auVar155._8_4_ = uVar140;
    auVar155._12_4_ = uVar140;
    auVar92 = vshufps_avx(auVar89,auVar89,0x55);
    auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
    auVar179._0_4_ = fVar157 * auVar89._0_4_;
    auVar179._4_4_ = fVar175 * auVar89._4_4_;
    auVar179._8_4_ = fVar178 * auVar89._8_4_;
    auVar179._12_4_ = fVar147 * auVar89._12_4_;
    auVar92 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar92);
    auVar27 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar4,auVar155);
    auVar89 = vsubps_avx512vl(local_810,auVar87);
    uVar140 = auVar89._0_4_;
    auVar156._4_4_ = uVar140;
    auVar156._0_4_ = uVar140;
    auVar156._8_4_ = uVar140;
    auVar156._12_4_ = uVar140;
    auVar92 = vshufps_avx(auVar89,auVar89,0x55);
    auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
    auVar182._0_4_ = fVar157 * auVar89._0_4_;
    auVar182._4_4_ = fVar175 * auVar89._4_4_;
    auVar182._8_4_ = fVar178 * auVar89._8_4_;
    auVar182._12_4_ = fVar147 * auVar89._12_4_;
    auVar92 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar5,auVar92);
    auVar83 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar4,auVar156);
    auVar92 = vsubps_avx512vl(_local_690,auVar87);
    uVar140 = auVar92._0_4_;
    auVar151._4_4_ = uVar140;
    auVar151._0_4_ = uVar140;
    auVar151._8_4_ = uVar140;
    auVar151._12_4_ = uVar140;
    auVar87 = vshufps_avx(auVar92,auVar92,0x55);
    auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
    auVar187._0_4_ = fVar157 * auVar92._0_4_;
    auVar187._4_4_ = fVar175 * auVar92._4_4_;
    auVar187._8_4_ = fVar178 * auVar92._8_4_;
    auVar187._12_4_ = fVar147 * auVar92._12_4_;
    auVar87 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar5,auVar87);
    auVar79 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar4,auVar151);
    lVar70 = (long)iVar7 * 0x44;
    auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar70);
    uVar140 = auVar88._0_4_;
    local_700._4_4_ = uVar140;
    local_700._0_4_ = uVar140;
    local_700._8_4_ = uVar140;
    local_700._12_4_ = uVar140;
    local_700._16_4_ = uVar140;
    local_700._20_4_ = uVar140;
    local_700._24_4_ = uVar140;
    local_700._28_4_ = uVar140;
    auVar94._8_4_ = 1;
    auVar94._0_8_ = 0x100000001;
    auVar94._12_4_ = 1;
    auVar94._16_4_ = 1;
    auVar94._20_4_ = 1;
    auVar94._24_4_ = 1;
    auVar94._28_4_ = 1;
    local_6e0 = vpermps_avx2(auVar94,ZEXT1632(auVar88));
    auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x484);
    uVar140 = auVar27._0_4_;
    local_840._4_4_ = uVar140;
    local_840._0_4_ = uVar140;
    local_840._8_4_ = uVar140;
    local_840._12_4_ = uVar140;
    local_840._16_4_ = uVar140;
    local_840._20_4_ = uVar140;
    local_840._24_4_ = uVar140;
    local_840._28_4_ = uVar140;
    local_860 = vpermps_avx512vl(auVar94,ZEXT1632(auVar27));
    auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x908);
    local_7a0 = vbroadcastss_avx512vl(auVar83);
    local_720 = vpermps_avx512vl(auVar94,ZEXT1632(auVar83));
    auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0xd8c);
    local_7c0 = vbroadcastss_avx512vl(auVar79);
    auVar198 = ZEXT3264(local_7c0);
    local_7e0 = vpermps_avx512vl(auVar94,ZEXT1632(auVar79));
    auVar200 = ZEXT3264(local_7e0);
    auVar94 = vmulps_avx512vl(local_7c0,auVar106);
    auVar95 = vmulps_avx512vl(local_7e0,auVar106);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar107,local_7a0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar107,local_720);
    auVar87 = vfmadd231ps_fma(auVar94,auVar109,local_840);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar109,local_860);
    auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar108,local_700);
    auVar97 = vfmadd231ps_avx512vl(auVar94,auVar108,local_6e0);
    auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar70);
    auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x484);
    auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x908);
    auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0xd8c);
    auVar98 = vmulps_avx512vl(local_7c0,auVar104);
    auVar99 = vmulps_avx512vl(local_7e0,auVar104);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar105,local_7a0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar105,local_720);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,local_840);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,local_860);
    auVar80 = vfmadd231ps_fma(auVar98,auVar94,local_700);
    auVar81 = vfmadd231ps_fma(auVar99,auVar94,local_6e0);
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar80),auVar96);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar81),auVar97);
    auVar100 = vmulps_avx512vl(auVar97,auVar98);
    auVar101 = vmulps_avx512vl(auVar96,auVar99);
    auVar100 = vsubps_avx512vl(auVar100,auVar101);
    auVar87 = vshufps_avx(local_7f0,local_7f0,0xff);
    uVar148 = auVar87._0_8_;
    local_360._8_8_ = uVar148;
    local_360._0_8_ = uVar148;
    local_360._16_8_ = uVar148;
    local_360._24_8_ = uVar148;
    auVar87 = vshufps_avx(local_800,local_800,0xff);
    local_380 = vbroadcastsd_avx512vl(auVar87);
    auVar87 = vshufps_avx512vl(local_810,local_810,0xff);
    local_3a0 = vbroadcastsd_avx512vl(auVar87);
    auVar87 = vshufps_avx512vl(_local_690,_local_690,0xff);
    uVar148 = auVar87._0_8_;
    register0x000012c8 = uVar148;
    local_3c0 = uVar148;
    register0x000012d0 = uVar148;
    register0x000012d8 = uVar148;
    auVar101 = vmulps_avx512vl(_local_3c0,auVar106);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,local_3a0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar109,local_380);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,local_360);
    auVar102 = vmulps_avx512vl(_local_3c0,auVar104);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar105,local_3a0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar95,local_380);
    auVar82 = vfmadd231ps_fma(auVar102,auVar94,local_360);
    auVar102 = vmulps_avx512vl(auVar99,auVar99);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,auVar98);
    auVar103 = vmaxps_avx512vl(auVar101,ZEXT1632(auVar82));
    auVar103 = vmulps_avx512vl(auVar103,auVar103);
    auVar102 = vmulps_avx512vl(auVar103,auVar102);
    auVar100 = vmulps_avx512vl(auVar100,auVar100);
    uVar148 = vcmpps_avx512vl(auVar100,auVar102,2);
    auVar87 = vblendps_avx(auVar88,local_7f0,8);
    auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar92 = vandps_avx512vl(auVar87,auVar89);
    auVar87 = vblendps_avx(auVar27,local_800,8);
    auVar87 = vandps_avx512vl(auVar87,auVar89);
    auVar92 = vmaxps_avx(auVar92,auVar87);
    auVar87 = vblendps_avx(auVar83,local_810,8);
    auVar84 = vandps_avx512vl(auVar87,auVar89);
    auVar87 = vblendps_avx(auVar79,_local_690,8);
    auVar87 = vandps_avx512vl(auVar87,auVar89);
    auVar87 = vmaxps_avx(auVar84,auVar87);
    auVar87 = vmaxps_avx(auVar92,auVar87);
    auVar92 = vmovshdup_avx(auVar87);
    auVar92 = vmaxss_avx(auVar92,auVar87);
    auVar87 = vshufpd_avx(auVar87,auVar87,1);
    auVar89 = vcvtsi2ss_avx512f(_local_690,iVar7);
    auVar87 = vmaxss_avx(auVar87,auVar92);
    local_480._0_16_ = auVar89;
    fVar157 = auVar89._0_4_;
    auVar102._4_4_ = fVar157;
    auVar102._0_4_ = fVar157;
    auVar102._8_4_ = fVar157;
    auVar102._12_4_ = fVar157;
    auVar102._16_4_ = fVar157;
    auVar102._20_4_ = fVar157;
    auVar102._24_4_ = fVar157;
    auVar102._28_4_ = fVar157;
    uVar30 = vcmpps_avx512vl(auVar102,_DAT_01f7b060,0xe);
    bVar71 = (byte)uVar148 & (byte)uVar30;
    auVar87 = vmulss_avx512f(auVar87,ZEXT416(0x35000000));
    auVar100._8_4_ = 2;
    auVar100._0_8_ = 0x200000002;
    auVar100._12_4_ = 2;
    auVar100._16_4_ = 2;
    auVar100._20_4_ = 2;
    auVar100._24_4_ = 2;
    auVar100._28_4_ = 2;
    local_3e0 = vpermps_avx512vl(auVar100,ZEXT1632(auVar88));
    local_400 = vpermps_avx512vl(auVar100,ZEXT1632(auVar27));
    local_420 = vpermps_avx512vl(auVar100,ZEXT1632(auVar83));
    local_780 = vpermps_avx2(auVar100,ZEXT1632(auVar79));
    auVar146 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar146);
    uVar176 = *(uint *)(ray + k * 4 + 0xc0);
    auVar92 = local_3e0._0_16_;
    if (bVar71 == 0) {
      bVar66 = false;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar193 = ZEXT3264(auVar108);
      auVar92 = vxorps_avx512vl(auVar92,auVar92);
      auVar194 = ZEXT1664(auVar92);
      auVar195 = ZEXT3264(local_700);
      auVar196 = ZEXT3264(local_6e0);
      auVar192 = ZEXT3264(local_840);
      auVar146 = ZEXT3264(local_860);
      auVar197 = ZEXT3264(local_7a0);
      auVar199 = ZEXT3264(local_720);
    }
    else {
      local_740._0_16_ = ZEXT416(uVar176);
      local_6c0._0_16_ = auVar87;
      auVar104 = vmulps_avx512vl(local_780,auVar104);
      auVar105 = vfmadd213ps_avx512vl(auVar105,local_420,auVar104);
      auVar95 = vfmadd213ps_avx512vl(auVar95,local_400,auVar105);
      auVar104 = vfmadd213ps_avx512vl(auVar94,local_3e0,auVar95);
      auVar106 = vmulps_avx512vl(local_780,auVar106);
      auVar107 = vfmadd213ps_avx512vl(auVar107,local_420,auVar106);
      auVar95 = vfmadd213ps_avx512vl(auVar109,local_400,auVar107);
      auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1210);
      auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1694);
      auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1b18);
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1f9c);
      auVar100 = vfmadd213ps_avx512vl(auVar108,local_3e0,auVar95);
      auVar108 = vmulps_avx512vl(local_7c0,auVar94);
      auVar95 = vmulps_avx512vl(local_7e0,auVar94);
      auVar94 = vmulps_avx512vl(local_780,auVar94);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,local_7a0);
      auVar89 = vfmadd231ps_fma(auVar95,auVar106,local_720);
      auVar106 = vfmadd231ps_avx512vl(auVar94,local_420,auVar106);
      auVar88 = vfmadd231ps_fma(auVar108,auVar107,local_840);
      auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar107,local_860);
      auVar94 = vfmadd231ps_avx512vl(auVar106,local_400,auVar107);
      auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar109,local_700);
      auVar105 = vfmadd231ps_avx512vl(auVar108,auVar109,local_6e0);
      auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1210);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1b18);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1f9c);
      auVar94 = vfmadd231ps_avx512vl(auVar94,local_3e0,auVar109);
      auVar109 = vmulps_avx512vl(local_7c0,auVar106);
      auVar102 = vmulps_avx512vl(local_7e0,auVar106);
      auVar106 = vmulps_avx512vl(local_780,auVar106);
      auVar201 = ZEXT1664(auVar87);
      auVar103 = vfmadd231ps_avx512vl(auVar109,auVar107,local_7a0);
      auVar89 = vfmadd231ps_fma(auVar102,auVar107,local_720);
      auVar199 = ZEXT3264(local_720);
      auVar107 = vfmadd231ps_avx512vl(auVar106,local_420,auVar107);
      auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1694);
      auVar106 = vfmadd231ps_avx512vl(auVar103,auVar109,local_840);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar109,local_860);
      auVar109 = vfmadd231ps_avx512vl(auVar107,local_400,auVar109);
      auVar107 = vfmadd231ps_avx512vl(auVar106,auVar108,local_700);
      auVar106 = vfmadd231ps_avx512vl(auVar102,auVar108,local_6e0);
      auVar102 = vfmadd231ps_avx512vl(auVar109,local_3e0,auVar108);
      auVar190._8_4_ = 0x7fffffff;
      auVar190._0_8_ = 0x7fffffff7fffffff;
      auVar190._12_4_ = 0x7fffffff;
      auVar190._16_4_ = 0x7fffffff;
      auVar190._20_4_ = 0x7fffffff;
      auVar190._24_4_ = 0x7fffffff;
      auVar190._28_4_ = 0x7fffffff;
      auVar108 = vandps_avx(auVar95,auVar190);
      auVar109 = vandps_avx(auVar105,auVar190);
      auVar109 = vmaxps_avx(auVar108,auVar109);
      auVar108 = vandps_avx(auVar94,auVar190);
      auVar108 = vmaxps_avx(auVar109,auVar108);
      auVar94 = vbroadcastss_avx512vl(auVar87);
      uVar62 = vcmpps_avx512vl(auVar108,auVar94,1);
      bVar66 = (bool)((byte)uVar62 & 1);
      auVar103._0_4_ = (float)((uint)bVar66 * auVar98._0_4_ | (uint)!bVar66 * auVar95._0_4_);
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar103._4_4_ = (float)((uint)bVar66 * auVar98._4_4_ | (uint)!bVar66 * auVar95._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar103._8_4_ = (float)((uint)bVar66 * auVar98._8_4_ | (uint)!bVar66 * auVar95._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar103._12_4_ = (float)((uint)bVar66 * auVar98._12_4_ | (uint)!bVar66 * auVar95._12_4_);
      bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar103._16_4_ = (float)((uint)bVar66 * auVar98._16_4_ | (uint)!bVar66 * auVar95._16_4_);
      bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar103._20_4_ = (float)((uint)bVar66 * auVar98._20_4_ | (uint)!bVar66 * auVar95._20_4_);
      bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar103._24_4_ = (float)((uint)bVar66 * auVar98._24_4_ | (uint)!bVar66 * auVar95._24_4_);
      bVar66 = SUB81(uVar62 >> 7,0);
      auVar103._28_4_ = (uint)bVar66 * auVar98._28_4_ | (uint)!bVar66 * auVar95._28_4_;
      bVar66 = (bool)((byte)uVar62 & 1);
      auVar119._0_4_ = (float)((uint)bVar66 * auVar99._0_4_ | (uint)!bVar66 * auVar105._0_4_);
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar119._4_4_ = (float)((uint)bVar66 * auVar99._4_4_ | (uint)!bVar66 * auVar105._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar119._8_4_ = (float)((uint)bVar66 * auVar99._8_4_ | (uint)!bVar66 * auVar105._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar119._12_4_ = (float)((uint)bVar66 * auVar99._12_4_ | (uint)!bVar66 * auVar105._12_4_);
      bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar119._16_4_ = (float)((uint)bVar66 * auVar99._16_4_ | (uint)!bVar66 * auVar105._16_4_);
      bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar119._20_4_ = (float)((uint)bVar66 * auVar99._20_4_ | (uint)!bVar66 * auVar105._20_4_);
      bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar119._24_4_ = (float)((uint)bVar66 * auVar99._24_4_ | (uint)!bVar66 * auVar105._24_4_);
      bVar66 = SUB81(uVar62 >> 7,0);
      auVar119._28_4_ = (uint)bVar66 * auVar99._28_4_ | (uint)!bVar66 * auVar105._28_4_;
      auVar108 = vandps_avx(auVar190,auVar107);
      auVar109 = vandps_avx(auVar106,auVar190);
      auVar109 = vmaxps_avx(auVar108,auVar109);
      auVar108 = vandps_avx(auVar102,auVar190);
      auVar108 = vmaxps_avx(auVar109,auVar108);
      uVar62 = vcmpps_avx512vl(auVar108,auVar94,1);
      bVar66 = (bool)((byte)uVar62 & 1);
      auVar110._0_4_ = (float)((uint)bVar66 * auVar98._0_4_ | (uint)!bVar66 * auVar107._0_4_);
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar66 * auVar98._4_4_ | (uint)!bVar66 * auVar107._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar66 * auVar98._8_4_ | (uint)!bVar66 * auVar107._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar66 * auVar98._12_4_ | (uint)!bVar66 * auVar107._12_4_);
      bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar110._16_4_ = (float)((uint)bVar66 * auVar98._16_4_ | (uint)!bVar66 * auVar107._16_4_);
      bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar110._20_4_ = (float)((uint)bVar66 * auVar98._20_4_ | (uint)!bVar66 * auVar107._20_4_);
      bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar110._24_4_ = (float)((uint)bVar66 * auVar98._24_4_ | (uint)!bVar66 * auVar107._24_4_);
      bVar66 = SUB81(uVar62 >> 7,0);
      auVar110._28_4_ = (uint)bVar66 * auVar98._28_4_ | (uint)!bVar66 * auVar107._28_4_;
      bVar66 = (bool)((byte)uVar62 & 1);
      auVar111._0_4_ = (float)((uint)bVar66 * auVar99._0_4_ | (uint)!bVar66 * auVar106._0_4_);
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar66 * auVar99._4_4_ | (uint)!bVar66 * auVar106._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar66 * auVar99._8_4_ | (uint)!bVar66 * auVar106._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar66 * auVar99._12_4_ | (uint)!bVar66 * auVar106._12_4_);
      bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar111._16_4_ = (float)((uint)bVar66 * auVar99._16_4_ | (uint)!bVar66 * auVar106._16_4_);
      bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar111._20_4_ = (float)((uint)bVar66 * auVar99._20_4_ | (uint)!bVar66 * auVar106._20_4_);
      bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar111._24_4_ = (float)((uint)bVar66 * auVar99._24_4_ | (uint)!bVar66 * auVar106._24_4_);
      bVar66 = SUB81(uVar62 >> 7,0);
      auVar111._28_4_ = (uint)bVar66 * auVar99._28_4_ | (uint)!bVar66 * auVar106._28_4_;
      auVar93 = vxorps_avx512vl(auVar92,auVar92);
      auVar194 = ZEXT1664(auVar93);
      auVar108 = vfmadd213ps_avx512vl(auVar103,auVar103,ZEXT1632(auVar93));
      auVar92 = vfmadd231ps_fma(auVar108,auVar119,auVar119);
      auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar92));
      fVar175 = auVar107._0_4_;
      fVar178 = auVar107._4_4_;
      fVar147 = auVar107._8_4_;
      fVar171 = auVar107._12_4_;
      fVar170 = auVar107._16_4_;
      fVar173 = auVar107._20_4_;
      fVar72 = auVar107._24_4_;
      auVar108._4_4_ = fVar178 * fVar178 * fVar178 * auVar92._4_4_ * -0.5;
      auVar108._0_4_ = fVar175 * fVar175 * fVar175 * auVar92._0_4_ * -0.5;
      auVar108._8_4_ = fVar147 * fVar147 * fVar147 * auVar92._8_4_ * -0.5;
      auVar108._12_4_ = fVar171 * fVar171 * fVar171 * auVar92._12_4_ * -0.5;
      auVar108._16_4_ = fVar170 * fVar170 * fVar170 * -0.0;
      auVar108._20_4_ = fVar173 * fVar173 * fVar173 * -0.0;
      auVar108._24_4_ = fVar72 * fVar72 * fVar72 * -0.0;
      auVar108._28_4_ = 0;
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar94,auVar107);
      auVar109._4_4_ = auVar119._4_4_ * auVar108._4_4_;
      auVar109._0_4_ = auVar119._0_4_ * auVar108._0_4_;
      auVar109._8_4_ = auVar119._8_4_ * auVar108._8_4_;
      auVar109._12_4_ = auVar119._12_4_ * auVar108._12_4_;
      auVar109._16_4_ = auVar119._16_4_ * auVar108._16_4_;
      auVar109._20_4_ = auVar119._20_4_ * auVar108._20_4_;
      auVar109._24_4_ = auVar119._24_4_ * auVar108._24_4_;
      auVar109._28_4_ = auVar107._28_4_;
      auVar107._4_4_ = auVar108._4_4_ * -auVar103._4_4_;
      auVar107._0_4_ = auVar108._0_4_ * -auVar103._0_4_;
      auVar107._8_4_ = auVar108._8_4_ * -auVar103._8_4_;
      auVar107._12_4_ = auVar108._12_4_ * -auVar103._12_4_;
      auVar107._16_4_ = auVar108._16_4_ * -auVar103._16_4_;
      auVar107._20_4_ = auVar108._20_4_ * -auVar103._20_4_;
      auVar107._24_4_ = auVar108._24_4_ * -auVar103._24_4_;
      auVar107._28_4_ = auVar103._28_4_ ^ 0x80000000;
      auVar98 = vmulps_avx512vl(auVar108,ZEXT1632(auVar93));
      auVar99 = ZEXT1632(auVar93);
      auVar106 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar99);
      auVar92 = vfmadd231ps_fma(auVar106,auVar111,auVar111);
      auVar105 = vrsqrt14ps_avx512vl(ZEXT1632(auVar92));
      fVar175 = auVar105._0_4_;
      fVar178 = auVar105._4_4_;
      fVar147 = auVar105._8_4_;
      fVar171 = auVar105._12_4_;
      fVar170 = auVar105._16_4_;
      fVar173 = auVar105._20_4_;
      fVar72 = auVar105._24_4_;
      auVar106._4_4_ = fVar178 * fVar178 * fVar178 * auVar92._4_4_ * -0.5;
      auVar106._0_4_ = fVar175 * fVar175 * fVar175 * auVar92._0_4_ * -0.5;
      auVar106._8_4_ = fVar147 * fVar147 * fVar147 * auVar92._8_4_ * -0.5;
      auVar106._12_4_ = fVar171 * fVar171 * fVar171 * auVar92._12_4_ * -0.5;
      auVar106._16_4_ = fVar170 * fVar170 * fVar170 * -0.0;
      auVar106._20_4_ = fVar173 * fVar173 * fVar173 * -0.0;
      auVar106._24_4_ = fVar72 * fVar72 * fVar72 * -0.0;
      auVar106._28_4_ = 0;
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar94,auVar105);
      auVar95._4_4_ = auVar111._4_4_ * auVar106._4_4_;
      auVar95._0_4_ = auVar111._0_4_ * auVar106._0_4_;
      auVar95._8_4_ = auVar111._8_4_ * auVar106._8_4_;
      auVar95._12_4_ = auVar111._12_4_ * auVar106._12_4_;
      auVar95._16_4_ = auVar111._16_4_ * auVar106._16_4_;
      auVar95._20_4_ = auVar111._20_4_ * auVar106._20_4_;
      auVar95._24_4_ = auVar111._24_4_ * auVar106._24_4_;
      auVar95._28_4_ = auVar105._28_4_;
      auVar105._4_4_ = -auVar110._4_4_ * auVar106._4_4_;
      auVar105._0_4_ = -auVar110._0_4_ * auVar106._0_4_;
      auVar105._8_4_ = -auVar110._8_4_ * auVar106._8_4_;
      auVar105._12_4_ = -auVar110._12_4_ * auVar106._12_4_;
      auVar105._16_4_ = -auVar110._16_4_ * auVar106._16_4_;
      auVar105._20_4_ = -auVar110._20_4_ * auVar106._20_4_;
      auVar105._24_4_ = -auVar110._24_4_ * auVar106._24_4_;
      auVar105._28_4_ = auVar108._28_4_;
      auVar108 = vmulps_avx512vl(auVar106,auVar99);
      auVar92 = vfmadd213ps_fma(auVar109,auVar101,auVar96);
      auVar89 = vfmadd213ps_fma(auVar107,auVar101,auVar97);
      auVar106 = vfmadd213ps_avx512vl(auVar98,auVar101,auVar100);
      auVar94 = vfmadd213ps_avx512vl(auVar95,ZEXT1632(auVar82),ZEXT1632(auVar80));
      auVar84 = vfnmadd213ps_fma(auVar109,auVar101,auVar96);
      auVar96 = ZEXT1632(auVar82);
      auVar88 = vfmadd213ps_fma(auVar105,auVar96,ZEXT1632(auVar81));
      auVar85 = vfnmadd213ps_fma(auVar107,auVar101,auVar97);
      auVar27 = vfmadd213ps_fma(auVar108,auVar96,auVar104);
      auVar109 = vfnmadd231ps_avx512vl(auVar100,auVar101,auVar98);
      auVar80 = vfnmadd213ps_fma(auVar95,auVar96,ZEXT1632(auVar80));
      auVar81 = vfnmadd213ps_fma(auVar105,auVar96,ZEXT1632(auVar81));
      auVar86 = vfnmadd231ps_fma(auVar104,ZEXT1632(auVar82),auVar108);
      auVar107 = vsubps_avx512vl(auVar94,ZEXT1632(auVar84));
      auVar108 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar85));
      auVar95 = vsubps_avx512vl(ZEXT1632(auVar27),auVar109);
      auVar105 = vmulps_avx512vl(auVar108,auVar109);
      auVar83 = vfmsub231ps_fma(auVar105,ZEXT1632(auVar85),auVar95);
      auVar104._4_4_ = auVar84._4_4_ * auVar95._4_4_;
      auVar104._0_4_ = auVar84._0_4_ * auVar95._0_4_;
      auVar104._8_4_ = auVar84._8_4_ * auVar95._8_4_;
      auVar104._12_4_ = auVar84._12_4_ * auVar95._12_4_;
      auVar104._16_4_ = auVar95._16_4_ * 0.0;
      auVar104._20_4_ = auVar95._20_4_ * 0.0;
      auVar104._24_4_ = auVar95._24_4_ * 0.0;
      auVar104._28_4_ = auVar95._28_4_;
      auVar95 = vfmsub231ps_avx512vl(auVar104,auVar109,auVar107);
      auVar96._4_4_ = auVar85._4_4_ * auVar107._4_4_;
      auVar96._0_4_ = auVar85._0_4_ * auVar107._0_4_;
      auVar96._8_4_ = auVar85._8_4_ * auVar107._8_4_;
      auVar96._12_4_ = auVar85._12_4_ * auVar107._12_4_;
      auVar96._16_4_ = auVar107._16_4_ * 0.0;
      auVar96._20_4_ = auVar107._20_4_ * 0.0;
      auVar96._24_4_ = auVar107._24_4_ * 0.0;
      auVar96._28_4_ = auVar107._28_4_;
      auVar79 = vfmsub231ps_fma(auVar96,ZEXT1632(auVar84),auVar108);
      auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar99,auVar95);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar99,ZEXT1632(auVar83));
      auVar100 = ZEXT1632(auVar93);
      uVar62 = vcmpps_avx512vl(auVar108,auVar100,2);
      bVar61 = (byte)uVar62;
      fVar72 = (float)((uint)(bVar61 & 1) * auVar92._0_4_ |
                      (uint)!(bool)(bVar61 & 1) * auVar80._0_4_);
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      fVar132 = (float)((uint)bVar66 * auVar92._4_4_ | (uint)!bVar66 * auVar80._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      fVar134 = (float)((uint)bVar66 * auVar92._8_4_ | (uint)!bVar66 * auVar80._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      fVar136 = (float)((uint)bVar66 * auVar92._12_4_ | (uint)!bVar66 * auVar80._12_4_);
      auVar105 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar134,CONCAT44(fVar132,fVar72))));
      fVar73 = (float)((uint)(bVar61 & 1) * auVar89._0_4_ |
                      (uint)!(bool)(bVar61 & 1) * auVar81._0_4_);
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      fVar133 = (float)((uint)bVar66 * auVar89._4_4_ | (uint)!bVar66 * auVar81._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      fVar135 = (float)((uint)bVar66 * auVar89._8_4_ | (uint)!bVar66 * auVar81._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      fVar137 = (float)((uint)bVar66 * auVar89._12_4_ | (uint)!bVar66 * auVar81._12_4_);
      auVar104 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar135,CONCAT44(fVar133,fVar73))));
      auVar112._0_4_ =
           (float)((uint)(bVar61 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar86._0_4_);
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar66 * auVar106._4_4_ | (uint)!bVar66 * auVar86._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar66 * auVar106._8_4_ | (uint)!bVar66 * auVar86._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar66 * auVar106._12_4_ | (uint)!bVar66 * auVar86._12_4_);
      fVar178 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar106._16_4_);
      auVar112._16_4_ = fVar178;
      fVar175 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar106._20_4_);
      auVar112._20_4_ = fVar175;
      fVar147 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar106._24_4_);
      auVar112._24_4_ = fVar147;
      iVar1 = (uint)(byte)(uVar62 >> 7) * auVar106._28_4_;
      auVar112._28_4_ = iVar1;
      auVar107 = vblendmps_avx512vl(ZEXT1632(auVar84),auVar94);
      auVar113._0_4_ =
           (uint)(bVar61 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar89._0_4_;
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar66 * auVar107._4_4_ | (uint)!bVar66 * auVar89._4_4_;
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar66 * auVar107._8_4_ | (uint)!bVar66 * auVar89._8_4_;
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar66 * auVar107._12_4_ | (uint)!bVar66 * auVar89._12_4_;
      auVar113._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar107._16_4_;
      auVar113._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar107._20_4_;
      auVar113._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar107._24_4_;
      auVar113._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar107._28_4_;
      auVar107 = vblendmps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar88));
      auVar114._0_4_ =
           (float)((uint)(bVar61 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar83._0_4_);
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar114._4_4_ = (float)((uint)bVar66 * auVar107._4_4_ | (uint)!bVar66 * auVar83._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar114._8_4_ = (float)((uint)bVar66 * auVar107._8_4_ | (uint)!bVar66 * auVar83._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar114._12_4_ = (float)((uint)bVar66 * auVar107._12_4_ | (uint)!bVar66 * auVar83._12_4_);
      fVar171 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar107._16_4_);
      auVar114._16_4_ = fVar171;
      fVar170 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar107._20_4_);
      auVar114._20_4_ = fVar170;
      fVar173 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar107._24_4_);
      auVar114._24_4_ = fVar173;
      auVar114._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar107._28_4_;
      auVar107 = vblendmps_avx512vl(auVar109,ZEXT1632(auVar27));
      auVar115._0_4_ =
           (float)((uint)(bVar61 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar106._0_4_)
      ;
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar115._4_4_ = (float)((uint)bVar66 * auVar107._4_4_ | (uint)!bVar66 * auVar106._4_4_);
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar115._8_4_ = (float)((uint)bVar66 * auVar107._8_4_ | (uint)!bVar66 * auVar106._8_4_);
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar115._12_4_ = (float)((uint)bVar66 * auVar107._12_4_ | (uint)!bVar66 * auVar106._12_4_);
      bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
      auVar115._16_4_ = (float)((uint)bVar66 * auVar107._16_4_ | (uint)!bVar66 * auVar106._16_4_);
      bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
      auVar115._20_4_ = (float)((uint)bVar66 * auVar107._20_4_ | (uint)!bVar66 * auVar106._20_4_);
      bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
      auVar115._24_4_ = (float)((uint)bVar66 * auVar107._24_4_ | (uint)!bVar66 * auVar106._24_4_);
      bVar66 = SUB81(uVar62 >> 7,0);
      auVar115._28_4_ = (uint)bVar66 * auVar107._28_4_ | (uint)!bVar66 * auVar106._28_4_;
      auVar116._0_4_ =
           (uint)(bVar61 & 1) * (int)auVar84._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar94._0_4_;
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar66 * (int)auVar84._4_4_ | (uint)!bVar66 * auVar94._4_4_;
      bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar66 * (int)auVar84._8_4_ | (uint)!bVar66 * auVar94._8_4_;
      bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar66 * (int)auVar84._12_4_ | (uint)!bVar66 * auVar94._12_4_;
      auVar116._16_4_ = (uint)!(bool)((byte)(uVar62 >> 4) & 1) * auVar94._16_4_;
      auVar116._20_4_ = (uint)!(bool)((byte)(uVar62 >> 5) & 1) * auVar94._20_4_;
      auVar116._24_4_ = (uint)!(bool)((byte)(uVar62 >> 6) & 1) * auVar94._24_4_;
      auVar116._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar94._28_4_;
      bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar117._0_4_ =
           (uint)(bVar61 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar27._0_4_;
      bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * auVar27._4_4_;
      bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * auVar27._8_4_;
      bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * auVar27._12_4_;
      auVar117._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar109._16_4_;
      auVar117._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar109._20_4_;
      auVar117._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar109._24_4_;
      iVar2 = (uint)(byte)(uVar62 >> 7) * auVar109._28_4_;
      auVar117._28_4_ = iVar2;
      auVar96 = vsubps_avx512vl(auVar116,auVar105);
      auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar85._12_4_ |
                                               (uint)!bVar14 * auVar88._12_4_,
                                               CONCAT48((uint)bVar13 * (int)auVar85._8_4_ |
                                                        (uint)!bVar13 * auVar88._8_4_,
                                                        CONCAT44((uint)bVar66 * (int)auVar85._4_4_ |
                                                                 (uint)!bVar66 * auVar88._4_4_,
                                                                 (uint)(bVar61 & 1) *
                                                                 (int)auVar85._0_4_ |
                                                                 (uint)!(bool)(bVar61 & 1) *
                                                                 auVar88._0_4_)))),auVar104);
      auVar107 = vsubps_avx(auVar117,auVar112);
      auVar106 = vsubps_avx(auVar105,auVar113);
      auVar94 = vsubps_avx(auVar104,auVar114);
      auVar95 = vsubps_avx(auVar112,auVar115);
      auVar97._4_4_ = auVar107._4_4_ * fVar132;
      auVar97._0_4_ = auVar107._0_4_ * fVar72;
      auVar97._8_4_ = auVar107._8_4_ * fVar134;
      auVar97._12_4_ = auVar107._12_4_ * fVar136;
      auVar97._16_4_ = auVar107._16_4_ * 0.0;
      auVar97._20_4_ = auVar107._20_4_ * 0.0;
      auVar97._24_4_ = auVar107._24_4_ * 0.0;
      auVar97._28_4_ = iVar2;
      auVar92 = vfmsub231ps_fma(auVar97,auVar112,auVar96);
      auVar98._4_4_ = fVar133 * auVar96._4_4_;
      auVar98._0_4_ = fVar73 * auVar96._0_4_;
      auVar98._8_4_ = fVar135 * auVar96._8_4_;
      auVar98._12_4_ = fVar137 * auVar96._12_4_;
      auVar98._16_4_ = auVar96._16_4_ * 0.0;
      auVar98._20_4_ = auVar96._20_4_ * 0.0;
      auVar98._24_4_ = auVar96._24_4_ * 0.0;
      auVar98._28_4_ = auVar108._28_4_;
      auVar89 = vfmsub231ps_fma(auVar98,auVar105,auVar109);
      auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar100,ZEXT1632(auVar92));
      auVar164._0_4_ = auVar109._0_4_ * auVar112._0_4_;
      auVar164._4_4_ = auVar109._4_4_ * auVar112._4_4_;
      auVar164._8_4_ = auVar109._8_4_ * auVar112._8_4_;
      auVar164._12_4_ = auVar109._12_4_ * auVar112._12_4_;
      auVar164._16_4_ = auVar109._16_4_ * fVar178;
      auVar164._20_4_ = auVar109._20_4_ * fVar175;
      auVar164._24_4_ = auVar109._24_4_ * fVar147;
      auVar164._28_4_ = 0;
      auVar92 = vfmsub231ps_fma(auVar164,auVar104,auVar107);
      auVar97 = vfmadd231ps_avx512vl(auVar108,auVar100,ZEXT1632(auVar92));
      auVar108 = vmulps_avx512vl(auVar95,auVar113);
      auVar108 = vfmsub231ps_avx512vl(auVar108,auVar106,auVar115);
      auVar99._4_4_ = auVar94._4_4_ * auVar115._4_4_;
      auVar99._0_4_ = auVar94._0_4_ * auVar115._0_4_;
      auVar99._8_4_ = auVar94._8_4_ * auVar115._8_4_;
      auVar99._12_4_ = auVar94._12_4_ * auVar115._12_4_;
      auVar99._16_4_ = auVar94._16_4_ * auVar115._16_4_;
      auVar99._20_4_ = auVar94._20_4_ * auVar115._20_4_;
      auVar99._24_4_ = auVar94._24_4_ * auVar115._24_4_;
      auVar99._28_4_ = auVar115._28_4_;
      auVar92 = vfmsub231ps_fma(auVar99,auVar114,auVar95);
      auVar165._0_4_ = auVar114._0_4_ * auVar106._0_4_;
      auVar165._4_4_ = auVar114._4_4_ * auVar106._4_4_;
      auVar165._8_4_ = auVar114._8_4_ * auVar106._8_4_;
      auVar165._12_4_ = auVar114._12_4_ * auVar106._12_4_;
      auVar165._16_4_ = fVar171 * auVar106._16_4_;
      auVar165._20_4_ = fVar170 * auVar106._20_4_;
      auVar165._24_4_ = fVar173 * auVar106._24_4_;
      auVar165._28_4_ = 0;
      auVar89 = vfmsub231ps_fma(auVar165,auVar94,auVar113);
      auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar100,auVar108);
      auVar98 = vfmadd231ps_avx512vl(auVar108,auVar100,ZEXT1632(auVar92));
      auVar108 = vmaxps_avx(auVar97,auVar98);
      uVar148 = vcmpps_avx512vl(auVar108,auVar100,2);
      bVar71 = bVar71 & (byte)uVar148;
      auVar195 = ZEXT3264(local_700);
      auVar196 = ZEXT3264(local_6e0);
      auVar192 = ZEXT3264(local_840);
      auVar146 = ZEXT3264(local_860);
      if (bVar71 == 0) {
        bVar66 = false;
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar193 = ZEXT3264(auVar108);
        auVar197 = ZEXT3264(local_7a0);
        auVar198 = ZEXT3264(local_7c0);
        auVar200 = ZEXT3264(local_7e0);
      }
      else {
        auVar37._4_4_ = auVar95._4_4_ * auVar109._4_4_;
        auVar37._0_4_ = auVar95._0_4_ * auVar109._0_4_;
        auVar37._8_4_ = auVar95._8_4_ * auVar109._8_4_;
        auVar37._12_4_ = auVar95._12_4_ * auVar109._12_4_;
        auVar37._16_4_ = auVar95._16_4_ * auVar109._16_4_;
        auVar37._20_4_ = auVar95._20_4_ * auVar109._20_4_;
        auVar37._24_4_ = auVar95._24_4_ * auVar109._24_4_;
        auVar37._28_4_ = auVar108._28_4_;
        auVar88 = vfmsub231ps_fma(auVar37,auVar94,auVar107);
        auVar38._4_4_ = auVar107._4_4_ * auVar106._4_4_;
        auVar38._0_4_ = auVar107._0_4_ * auVar106._0_4_;
        auVar38._8_4_ = auVar107._8_4_ * auVar106._8_4_;
        auVar38._12_4_ = auVar107._12_4_ * auVar106._12_4_;
        auVar38._16_4_ = auVar107._16_4_ * auVar106._16_4_;
        auVar38._20_4_ = auVar107._20_4_ * auVar106._20_4_;
        auVar38._24_4_ = auVar107._24_4_ * auVar106._24_4_;
        auVar38._28_4_ = auVar107._28_4_;
        auVar89 = vfmsub231ps_fma(auVar38,auVar96,auVar95);
        auVar39._4_4_ = auVar94._4_4_ * auVar96._4_4_;
        auVar39._0_4_ = auVar94._0_4_ * auVar96._0_4_;
        auVar39._8_4_ = auVar94._8_4_ * auVar96._8_4_;
        auVar39._12_4_ = auVar94._12_4_ * auVar96._12_4_;
        auVar39._16_4_ = auVar94._16_4_ * auVar96._16_4_;
        auVar39._20_4_ = auVar94._20_4_ * auVar96._20_4_;
        auVar39._24_4_ = auVar94._24_4_ * auVar96._24_4_;
        auVar39._28_4_ = auVar94._28_4_;
        auVar27 = vfmsub231ps_fma(auVar39,auVar106,auVar109);
        auVar92 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar27));
        auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar88),auVar100);
        auVar109 = vrcp14ps_avx512vl(auVar108);
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar193 = ZEXT3264(auVar107);
        auVar106 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar107);
        auVar92 = vfmadd132ps_fma(auVar106,auVar109,auVar109);
        auVar40._4_4_ = auVar27._4_4_ * auVar112._4_4_;
        auVar40._0_4_ = auVar27._0_4_ * auVar112._0_4_;
        auVar40._8_4_ = auVar27._8_4_ * auVar112._8_4_;
        auVar40._12_4_ = auVar27._12_4_ * auVar112._12_4_;
        auVar40._16_4_ = fVar178 * 0.0;
        auVar40._20_4_ = fVar175 * 0.0;
        auVar40._24_4_ = fVar147 * 0.0;
        auVar40._28_4_ = iVar1;
        auVar89 = vfmadd231ps_fma(auVar40,auVar104,ZEXT1632(auVar89));
        auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar105,ZEXT1632(auVar88));
        fVar175 = auVar92._0_4_;
        fVar178 = auVar92._4_4_;
        fVar147 = auVar92._8_4_;
        fVar171 = auVar92._12_4_;
        local_5a0 = ZEXT1632(CONCAT412(auVar89._12_4_ * fVar171,
                                       CONCAT48(auVar89._8_4_ * fVar147,
                                                CONCAT44(auVar89._4_4_ * fVar178,
                                                         auVar89._0_4_ * fVar175))));
        auVar174._4_4_ = uVar176;
        auVar174._0_4_ = uVar176;
        auVar174._8_4_ = uVar176;
        auVar174._12_4_ = uVar176;
        auVar174._16_4_ = uVar176;
        auVar174._20_4_ = uVar176;
        auVar174._24_4_ = uVar176;
        auVar174._28_4_ = uVar176;
        uVar148 = vcmpps_avx512vl(auVar174,local_5a0,2);
        uVar140 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar32._4_4_ = uVar140;
        auVar32._0_4_ = uVar140;
        auVar32._8_4_ = uVar140;
        auVar32._12_4_ = uVar140;
        auVar32._16_4_ = uVar140;
        auVar32._20_4_ = uVar140;
        auVar32._24_4_ = uVar140;
        auVar32._28_4_ = uVar140;
        uVar30 = vcmpps_avx512vl(local_5a0,auVar32,2);
        bVar71 = (byte)uVar148 & (byte)uVar30 & bVar71;
        auVar197 = ZEXT3264(local_7a0);
        auVar198 = ZEXT3264(local_7c0);
        auVar200 = ZEXT3264(local_7e0);
        if (bVar71 != 0) {
          uVar148 = vcmpps_avx512vl(auVar108,auVar100,4);
          bVar71 = bVar71 & (byte)uVar148;
          if (bVar71 != 0) {
            fVar170 = auVar97._0_4_ * fVar175;
            fVar173 = auVar97._4_4_ * fVar178;
            auVar41._4_4_ = fVar173;
            auVar41._0_4_ = fVar170;
            fVar72 = auVar97._8_4_ * fVar147;
            auVar41._8_4_ = fVar72;
            fVar73 = auVar97._12_4_ * fVar171;
            auVar41._12_4_ = fVar73;
            fVar132 = auVar97._16_4_ * 0.0;
            auVar41._16_4_ = fVar132;
            fVar133 = auVar97._20_4_ * 0.0;
            auVar41._20_4_ = fVar133;
            fVar134 = auVar97._24_4_ * 0.0;
            auVar41._24_4_ = fVar134;
            auVar41._28_4_ = auVar108._28_4_;
            auVar109 = vsubps_avx512vl(auVar107,auVar41);
            local_5e0._0_4_ =
                 (float)((uint)(bVar61 & 1) * (int)fVar170 |
                        (uint)!(bool)(bVar61 & 1) * auVar109._0_4_);
            bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
            local_5e0._4_4_ = (float)((uint)bVar66 * (int)fVar173 | (uint)!bVar66 * auVar109._4_4_);
            bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
            local_5e0._8_4_ = (float)((uint)bVar66 * (int)fVar72 | (uint)!bVar66 * auVar109._8_4_);
            bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
            local_5e0._12_4_ = (float)((uint)bVar66 * (int)fVar73 | (uint)!bVar66 * auVar109._12_4_)
            ;
            bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
            local_5e0._16_4_ =
                 (float)((uint)bVar66 * (int)fVar132 | (uint)!bVar66 * auVar109._16_4_);
            bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
            local_5e0._20_4_ =
                 (float)((uint)bVar66 * (int)fVar133 | (uint)!bVar66 * auVar109._20_4_);
            bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
            local_5e0._24_4_ =
                 (float)((uint)bVar66 * (int)fVar134 | (uint)!bVar66 * auVar109._24_4_);
            bVar66 = SUB81(uVar62 >> 7,0);
            local_5e0._28_4_ =
                 (float)((uint)bVar66 * auVar108._28_4_ | (uint)!bVar66 * auVar109._28_4_);
            auVar108 = vsubps_avx(ZEXT1632(auVar82),auVar101);
            auVar92 = vfmadd213ps_fma(auVar108,local_5e0,auVar101);
            uVar140 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
            auVar101._4_4_ = uVar140;
            auVar101._0_4_ = uVar140;
            auVar101._8_4_ = uVar140;
            auVar101._12_4_ = uVar140;
            auVar101._16_4_ = uVar140;
            auVar101._20_4_ = uVar140;
            auVar101._24_4_ = uVar140;
            auVar101._28_4_ = uVar140;
            auVar108 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar92._12_4_ + auVar92._12_4_,
                                                          CONCAT48(auVar92._8_4_ + auVar92._8_4_,
                                                                   CONCAT44(auVar92._4_4_ +
                                                                            auVar92._4_4_,
                                                                            auVar92._0_4_ +
                                                                            auVar92._0_4_)))),
                                       auVar101);
            uVar148 = vcmpps_avx512vl(local_5a0,auVar108,6);
            if (((byte)uVar148 & bVar71) != 0) {
              auVar160._0_4_ = auVar98._0_4_ * fVar175;
              auVar160._4_4_ = auVar98._4_4_ * fVar178;
              auVar160._8_4_ = auVar98._8_4_ * fVar147;
              auVar160._12_4_ = auVar98._12_4_ * fVar171;
              auVar160._16_4_ = auVar98._16_4_ * 0.0;
              auVar160._20_4_ = auVar98._20_4_ * 0.0;
              auVar160._24_4_ = auVar98._24_4_ * 0.0;
              auVar160._28_4_ = 0;
              auVar108 = vsubps_avx512vl(auVar107,auVar160);
              auVar118._0_4_ =
                   (uint)(bVar61 & 1) * (int)auVar160._0_4_ |
                   (uint)!(bool)(bVar61 & 1) * auVar108._0_4_;
              bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
              auVar118._4_4_ = (uint)bVar66 * (int)auVar160._4_4_ | (uint)!bVar66 * auVar108._4_4_;
              bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
              auVar118._8_4_ = (uint)bVar66 * (int)auVar160._8_4_ | (uint)!bVar66 * auVar108._8_4_;
              bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
              auVar118._12_4_ =
                   (uint)bVar66 * (int)auVar160._12_4_ | (uint)!bVar66 * auVar108._12_4_;
              bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
              auVar118._16_4_ =
                   (uint)bVar66 * (int)auVar160._16_4_ | (uint)!bVar66 * auVar108._16_4_;
              bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
              auVar118._20_4_ =
                   (uint)bVar66 * (int)auVar160._20_4_ | (uint)!bVar66 * auVar108._20_4_;
              bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
              auVar118._24_4_ =
                   (uint)bVar66 * (int)auVar160._24_4_ | (uint)!bVar66 * auVar108._24_4_;
              auVar118._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar108._28_4_;
              auVar33._8_4_ = 0x40000000;
              auVar33._0_8_ = 0x4000000040000000;
              auVar33._12_4_ = 0x40000000;
              auVar33._16_4_ = 0x40000000;
              auVar33._20_4_ = 0x40000000;
              auVar33._24_4_ = 0x40000000;
              auVar33._28_4_ = 0x40000000;
              local_5c0 = vfmsub132ps_avx512vl(auVar118,auVar107,auVar33);
              local_580 = 0;
              local_570 = local_7f0._0_8_;
              uStack_568 = local_7f0._8_8_;
              local_560 = local_800._0_8_;
              uStack_558 = local_800._8_8_;
              local_550 = local_810._0_8_;
              uStack_548 = local_810._8_8_;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar66 = true, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_018b6d6d;
                fVar157 = 1.0 / fVar157;
                local_520[0] = fVar157 * (local_5e0._0_4_ + 0.0);
                local_520[1] = fVar157 * (local_5e0._4_4_ + 1.0);
                local_520[2] = fVar157 * (local_5e0._8_4_ + 2.0);
                local_520[3] = fVar157 * (local_5e0._12_4_ + 3.0);
                fStack_510 = fVar157 * (local_5e0._16_4_ + 4.0);
                fStack_50c = fVar157 * (local_5e0._20_4_ + 5.0);
                fStack_508 = fVar157 * (local_5e0._24_4_ + 6.0);
                fStack_504 = local_5e0._28_4_ + 7.0;
                local_500 = local_5c0;
                local_4e0 = local_5a0;
                uVar62 = 0;
                uVar67 = (ulong)((byte)uVar148 & bVar71);
                for (uVar65 = uVar67; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000)
                {
                  uVar62 = uVar62 + 1;
                }
                auVar130 = vpbroadcastd_avx512f();
                local_4c0 = vmovdqa64_avx512f(auVar130);
                local_57c = iVar7;
                while( true ) {
                  auVar87 = auVar201._0_16_;
                  auVar92 = auVar194._0_16_;
                  if (uVar67 == 0) break;
                  uVar140 = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar62]));
                  local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar62 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar62 * 4);
                  local_890.context = context->user;
                  fVar147 = local_200._0_4_;
                  fVar175 = 1.0 - fVar147;
                  fVar157 = fVar175 * fVar175 * -3.0;
                  auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar175 * fVar175)),
                                            ZEXT416((uint)(fVar147 * fVar175)),ZEXT416(0xc0000000));
                  auVar89 = vfmsub132ss_fma(ZEXT416((uint)(fVar147 * fVar175)),
                                            ZEXT416((uint)(fVar147 * fVar147)),ZEXT416(0x40000000));
                  fVar175 = auVar87._0_4_ * 3.0;
                  fVar178 = auVar89._0_4_ * 3.0;
                  fVar147 = fVar147 * fVar147 * 3.0;
                  auVar168._0_4_ = fVar147 * (float)local_690._0_4_;
                  auVar168._4_4_ = fVar147 * (float)local_690._4_4_;
                  auVar168._8_4_ = fVar147 * fStack_688;
                  auVar168._12_4_ = fVar147 * fStack_684;
                  auVar142._4_4_ = fVar178;
                  auVar142._0_4_ = fVar178;
                  auVar142._8_4_ = fVar178;
                  auVar142._12_4_ = fVar178;
                  auVar87 = vfmadd132ps_fma(auVar142,auVar168,local_810);
                  auVar158._4_4_ = fVar175;
                  auVar158._0_4_ = fVar175;
                  auVar158._8_4_ = fVar175;
                  auVar158._12_4_ = fVar175;
                  auVar87 = vfmadd132ps_fma(auVar158,auVar87,local_800);
                  auVar143._4_4_ = fVar157;
                  auVar143._0_4_ = fVar157;
                  auVar143._8_4_ = fVar157;
                  auVar143._12_4_ = fVar157;
                  auVar87 = vfmadd132ps_fma(auVar143,auVar87,local_7f0);
                  auVar130 = vbroadcastss_avx512f(auVar87);
                  auVar131 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar131,ZEXT1664(auVar87));
                  auVar131 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar131,ZEXT1664(auVar87));
                  local_2c0[0] = (RTCHitN)auVar130[0];
                  local_2c0[1] = (RTCHitN)auVar130[1];
                  local_2c0[2] = (RTCHitN)auVar130[2];
                  local_2c0[3] = (RTCHitN)auVar130[3];
                  local_2c0[4] = (RTCHitN)auVar130[4];
                  local_2c0[5] = (RTCHitN)auVar130[5];
                  local_2c0[6] = (RTCHitN)auVar130[6];
                  local_2c0[7] = (RTCHitN)auVar130[7];
                  local_2c0[8] = (RTCHitN)auVar130[8];
                  local_2c0[9] = (RTCHitN)auVar130[9];
                  local_2c0[10] = (RTCHitN)auVar130[10];
                  local_2c0[0xb] = (RTCHitN)auVar130[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar130[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar130[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar130[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar130[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar130[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar130[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar130[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar130[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar130[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar130[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar130[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar130[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar130[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar130[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar130[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar130[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar130[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar130[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar130[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar130[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar130[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar130[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar130[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar130[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar130[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar130[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar130[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar130[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar130[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar130[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar130[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar130[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar130[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar130[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar130[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar130[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar130[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar130[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar130[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar130[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar130[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar130[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar130[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar130[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar130[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar130[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar130[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar130[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar130[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar130[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar130[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar130[0x3f];
                  local_180 = local_300._0_8_;
                  uStack_178 = local_300._8_8_;
                  uStack_170 = local_300._16_8_;
                  uStack_168 = local_300._24_8_;
                  uStack_160 = local_300._32_8_;
                  uStack_158 = local_300._40_8_;
                  uStack_150 = local_300._48_8_;
                  uStack_148 = local_300._56_8_;
                  auVar130 = vmovdqa64_avx512f(local_4c0);
                  local_140 = vmovdqa64_avx512f(auVar130);
                  vpcmpeqd_avx2(auVar130._0_32_,auVar130._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_890.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_890.context)->instPrimID[0]));
                  auVar130 = vmovdqa64_avx512f(local_340);
                  local_640 = vmovdqa64_avx512f(auVar130);
                  local_890.valid = (int *)local_640;
                  local_890.geometryUserPtr = pGVar8->userPtr;
                  local_890.hit = local_2c0;
                  local_890.N = 0x10;
                  local_660 = (uint)uVar67;
                  uStack_65c = (uint)(uVar67 >> 0x20);
                  local_680 = (undefined1  [8])uVar62;
                  auVar68 = (undefined1  [8])uVar62;
                  local_890.ray = (RTCRayN *)ray;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->occlusionFilterN)(&local_890);
                    uVar67 = CONCAT44(uStack_65c,local_660);
                    auVar201 = ZEXT1664(local_6c0._0_16_);
                    auVar200 = ZEXT3264(local_7e0);
                    auVar198 = ZEXT3264(local_7c0);
                    auVar199 = ZEXT3264(local_720);
                    auVar197 = ZEXT3264(local_7a0);
                    auVar146 = ZEXT3264(local_860);
                    auVar192 = ZEXT3264(local_840);
                    auVar196 = ZEXT3264(local_6e0);
                    auVar195 = ZEXT3264(local_700);
                    auVar87 = vxorps_avx512vl(auVar92,auVar92);
                    auVar194 = ZEXT1664(auVar87);
                    auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar193 = ZEXT3264(auVar108);
                    auVar130 = vmovdqa64_avx512f(local_640);
                    auVar68 = local_680;
                    uVar176 = local_740._0_4_;
                  }
                  auVar87 = auVar194._0_16_;
                  uVar148 = vptestmd_avx512f(auVar130,auVar130);
                  if ((short)uVar148 != 0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_890);
                      uVar67 = CONCAT44(uStack_65c,local_660);
                      auVar201 = ZEXT1664(local_6c0._0_16_);
                      auVar200 = ZEXT3264(local_7e0);
                      auVar198 = ZEXT3264(local_7c0);
                      auVar199 = ZEXT3264(local_720);
                      auVar197 = ZEXT3264(local_7a0);
                      auVar146 = ZEXT3264(local_860);
                      auVar192 = ZEXT3264(local_840);
                      auVar196 = ZEXT3264(local_6e0);
                      auVar195 = ZEXT3264(local_700);
                      auVar87 = vxorps_avx512vl(auVar87,auVar87);
                      auVar194 = ZEXT1664(auVar87);
                      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar193 = ZEXT3264(auVar108);
                      auVar130 = vmovdqa64_avx512f(local_640);
                      auVar68 = local_680;
                      uVar176 = local_740._0_4_;
                    }
                    auVar87 = auVar201._0_16_;
                    uVar62 = vptestmd_avx512f(auVar130,auVar130);
                    auVar130 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar66 = (bool)((byte)uVar62 & 1);
                    bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
                    bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
                    bVar14 = (bool)((byte)(uVar62 >> 3) & 1);
                    bVar15 = (bool)((byte)(uVar62 >> 4) & 1);
                    bVar16 = (bool)((byte)(uVar62 >> 5) & 1);
                    bVar17 = (bool)((byte)(uVar62 >> 6) & 1);
                    bVar18 = (bool)((byte)(uVar62 >> 7) & 1);
                    bVar19 = (bool)((byte)(uVar62 >> 8) & 1);
                    bVar20 = (bool)((byte)(uVar62 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar62 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar62 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar62 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar62 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar62 >> 0xe) & 1);
                    bVar26 = SUB81(uVar62 >> 0xf,0);
                    *(uint *)(local_890.ray + 0x200) =
                         (uint)bVar66 * auVar130._0_4_ |
                         (uint)!bVar66 * *(int *)(local_890.ray + 0x200);
                    *(uint *)(local_890.ray + 0x204) =
                         (uint)bVar12 * auVar130._4_4_ |
                         (uint)!bVar12 * *(int *)(local_890.ray + 0x204);
                    *(uint *)(local_890.ray + 0x208) =
                         (uint)bVar13 * auVar130._8_4_ |
                         (uint)!bVar13 * *(int *)(local_890.ray + 0x208);
                    *(uint *)(local_890.ray + 0x20c) =
                         (uint)bVar14 * auVar130._12_4_ |
                         (uint)!bVar14 * *(int *)(local_890.ray + 0x20c);
                    *(uint *)(local_890.ray + 0x210) =
                         (uint)bVar15 * auVar130._16_4_ |
                         (uint)!bVar15 * *(int *)(local_890.ray + 0x210);
                    *(uint *)(local_890.ray + 0x214) =
                         (uint)bVar16 * auVar130._20_4_ |
                         (uint)!bVar16 * *(int *)(local_890.ray + 0x214);
                    *(uint *)(local_890.ray + 0x218) =
                         (uint)bVar17 * auVar130._24_4_ |
                         (uint)!bVar17 * *(int *)(local_890.ray + 0x218);
                    *(uint *)(local_890.ray + 0x21c) =
                         (uint)bVar18 * auVar130._28_4_ |
                         (uint)!bVar18 * *(int *)(local_890.ray + 0x21c);
                    *(uint *)(local_890.ray + 0x220) =
                         (uint)bVar19 * auVar130._32_4_ |
                         (uint)!bVar19 * *(int *)(local_890.ray + 0x220);
                    *(uint *)(local_890.ray + 0x224) =
                         (uint)bVar20 * auVar130._36_4_ |
                         (uint)!bVar20 * *(int *)(local_890.ray + 0x224);
                    *(uint *)(local_890.ray + 0x228) =
                         (uint)bVar21 * auVar130._40_4_ |
                         (uint)!bVar21 * *(int *)(local_890.ray + 0x228);
                    *(uint *)(local_890.ray + 0x22c) =
                         (uint)bVar22 * auVar130._44_4_ |
                         (uint)!bVar22 * *(int *)(local_890.ray + 0x22c);
                    *(uint *)(local_890.ray + 0x230) =
                         (uint)bVar23 * auVar130._48_4_ |
                         (uint)!bVar23 * *(int *)(local_890.ray + 0x230);
                    *(uint *)(local_890.ray + 0x234) =
                         (uint)bVar24 * auVar130._52_4_ |
                         (uint)!bVar24 * *(int *)(local_890.ray + 0x234);
                    *(uint *)(local_890.ray + 0x238) =
                         (uint)bVar25 * auVar130._56_4_ |
                         (uint)!bVar25 * *(int *)(local_890.ray + 0x238);
                    *(uint *)(local_890.ray + 0x23c) =
                         (uint)bVar26 * auVar130._60_4_ |
                         (uint)!bVar26 * *(int *)(local_890.ray + 0x23c);
                    if ((short)uVar62 != 0) {
                      bVar66 = true;
                      goto LAB_018b6d6d;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar140;
                  uVar62 = 0;
                  uVar67 = uVar67 ^ 1L << ((ulong)auVar68 & 0x3f);
                  for (uVar65 = uVar67; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000
                      ) {
                    uVar62 = uVar62 + 1;
                  }
                }
              }
            }
          }
        }
        bVar66 = false;
      }
    }
LAB_018b6d6d:
    if (8 < iVar7) {
      local_6c0 = vpbroadcastd_avx512vl();
      local_740 = vbroadcastss_avx512vl(auVar87);
      local_680._0_4_ = 1.0 / (float)local_480._0_4_;
      local_680._4_4_ = local_680._0_4_;
      fStack_678 = (float)local_680._0_4_;
      fStack_674 = (float)local_680._0_4_;
      fStack_670 = (float)local_680._0_4_;
      fStack_66c = (float)local_680._0_4_;
      fStack_668 = (float)local_680._0_4_;
      register0x0000121c = local_680._0_4_;
      auVar201 = vpbroadcastd_avx512f();
      local_480 = vmovdqa64_avx512f(auVar201);
      local_660 = uVar176;
      uStack_65c = uVar176;
      uStack_658 = uVar176;
      uStack_654 = uVar176;
      uStack_650 = uVar176;
      uStack_64c = uVar176;
      uStack_648 = uVar176;
      uStack_644 = uVar176;
      for (lVar63 = 8; lVar63 < iVar7; lVar63 = lVar63 + 8) {
        auVar108 = vpbroadcastd_avx512vl();
        auVar94 = vpor_avx2(auVar108,_DAT_01fb4ba0);
        uVar30 = vpcmpd_avx512vl(auVar94,local_6c0,1);
        auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 * 4 + lVar70);
        auVar109 = *(undefined1 (*) [32])(lVar70 + 0x21fb768 + lVar63 * 4);
        auVar107 = *(undefined1 (*) [32])(lVar70 + 0x21fbbec + lVar63 * 4);
        auVar106 = *(undefined1 (*) [32])(lVar70 + 0x21fc070 + lVar63 * 4);
        local_7c0 = auVar198._0_32_;
        auVar95 = vmulps_avx512vl(local_7c0,auVar106);
        local_7e0 = auVar200._0_32_;
        auVar105 = vmulps_avx512vl(local_7e0,auVar106);
        auVar42._4_4_ = auVar106._4_4_ * (float)local_3c0._4_4_;
        auVar42._0_4_ = auVar106._0_4_ * (float)local_3c0._0_4_;
        auVar42._8_4_ = auVar106._8_4_ * fStack_3b8;
        auVar42._12_4_ = auVar106._12_4_ * fStack_3b4;
        auVar42._16_4_ = auVar106._16_4_ * fStack_3b0;
        auVar42._20_4_ = auVar106._20_4_ * fStack_3ac;
        auVar42._24_4_ = auVar106._24_4_ * fStack_3a8;
        auVar42._28_4_ = auVar94._28_4_;
        local_7a0 = auVar197._0_32_;
        auVar94 = vfmadd231ps_avx512vl(auVar95,auVar107,local_7a0);
        auVar113 = auVar199._0_32_;
        auVar95 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar113);
        auVar105 = vfmadd231ps_avx512vl(auVar42,auVar107,local_3a0);
        auVar111 = auVar192._0_32_;
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar109,auVar111);
        auVar110 = auVar146._0_32_;
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar109,auVar110);
        auVar87 = vfmadd231ps_fma(auVar105,auVar109,local_380);
        auVar112 = auVar195._0_32_;
        auVar98 = vfmadd231ps_avx512vl(auVar94,auVar108,auVar112);
        local_6e0 = auVar196._0_32_;
        auVar99 = vfmadd231ps_avx512vl(auVar95,auVar108,local_6e0);
        auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 * 4 + lVar70);
        auVar95 = *(undefined1 (*) [32])(lVar70 + 0x21fdb88 + lVar63 * 4);
        auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar108,local_360);
        auVar105 = *(undefined1 (*) [32])(lVar70 + 0x21fe00c + lVar63 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar70 + 0x21fe490 + lVar63 * 4);
        auVar96 = vmulps_avx512vl(local_7c0,auVar104);
        auVar97 = vmulps_avx512vl(local_7e0,auVar104);
        auVar43._4_4_ = auVar104._4_4_ * (float)local_3c0._4_4_;
        auVar43._0_4_ = auVar104._0_4_ * (float)local_3c0._0_4_;
        auVar43._8_4_ = auVar104._8_4_ * fStack_3b8;
        auVar43._12_4_ = auVar104._12_4_ * fStack_3b4;
        auVar43._16_4_ = auVar104._16_4_ * fStack_3b0;
        auVar43._20_4_ = auVar104._20_4_ * fStack_3ac;
        auVar43._24_4_ = auVar104._24_4_ * fStack_3a8;
        auVar43._28_4_ = uStack_3a4;
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,local_7a0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar105,auVar113);
        auVar100 = vfmadd231ps_avx512vl(auVar43,auVar105,local_3a0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar95,auVar111);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,auVar110);
        auVar92 = vfmadd231ps_fma(auVar100,auVar95,local_380);
        auVar100 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar112);
        auVar101 = vfmadd231ps_avx512vl(auVar97,auVar94,local_6e0);
        auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar94,local_360);
        auVar102 = vmaxps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar92));
        auVar96 = vsubps_avx(auVar100,auVar98);
        auVar97 = vsubps_avx(auVar101,auVar99);
        auVar103 = vmulps_avx512vl(auVar99,auVar96);
        auVar119 = vmulps_avx512vl(auVar98,auVar97);
        auVar103 = vsubps_avx512vl(auVar103,auVar119);
        auVar119 = vmulps_avx512vl(auVar97,auVar97);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar96,auVar96);
        auVar102 = vmulps_avx512vl(auVar102,auVar102);
        auVar102 = vmulps_avx512vl(auVar102,auVar119);
        auVar103 = vmulps_avx512vl(auVar103,auVar103);
        uVar148 = vcmpps_avx512vl(auVar103,auVar102,2);
        bVar71 = (byte)uVar30 & (byte)uVar148;
        if (bVar71 == 0) {
          auVar192 = ZEXT3264(auVar111);
          auVar146 = ZEXT3264(auVar110);
        }
        else {
          auVar104 = vmulps_avx512vl(local_780,auVar104);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_420,auVar104);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_400,auVar105);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_3e0,auVar95);
          auVar106 = vmulps_avx512vl(local_780,auVar106);
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_420,auVar106);
          auVar109 = vfmadd213ps_avx512vl(auVar109,local_400,auVar107);
          auVar95 = vfmadd213ps_avx512vl(auVar108,local_3e0,auVar109);
          auVar108 = *(undefined1 (*) [32])(lVar70 + 0x21fc4f4 + lVar63 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar70 + 0x21fc978 + lVar63 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar70 + 0x21fcdfc + lVar63 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar70 + 0x21fd280 + lVar63 * 4);
          auVar105 = vmulps_avx512vl(local_7c0,auVar106);
          auVar104 = vmulps_avx512vl(local_7e0,auVar106);
          auVar106 = vmulps_avx512vl(local_780,auVar106);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,local_7a0);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,auVar113);
          auVar107 = vfmadd231ps_avx512vl(auVar106,local_420,auVar107);
          auVar106 = vfmadd231ps_avx512vl(auVar105,auVar109,auVar111);
          auVar105 = vfmadd231ps_avx512vl(auVar104,auVar109,auVar110);
          auVar109 = vfmadd231ps_avx512vl(auVar107,local_400,auVar109);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,auVar112);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar108,local_6e0);
          auVar104 = vfmadd231ps_avx512vl(auVar109,local_3e0,auVar108);
          auVar108 = *(undefined1 (*) [32])(lVar70 + 0x21fe914 + lVar63 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar70 + 0x21ff21c + lVar63 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar70 + 0x21ff6a0 + lVar63 * 4);
          auVar102 = vmulps_avx512vl(local_7c0,auVar107);
          auVar103 = vmulps_avx512vl(local_7e0,auVar107);
          auVar107 = vmulps_avx512vl(local_780,auVar107);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,local_7a0);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,auVar113);
          auVar107 = vfmadd231ps_avx512vl(auVar107,local_420,auVar109);
          auVar109 = *(undefined1 (*) [32])(lVar70 + 0x21fed98 + lVar63 * 4);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,auVar111);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,auVar110);
          auVar109 = vfmadd231ps_avx512vl(auVar107,local_400,auVar109);
          auVar107 = vfmadd231ps_avx512vl(auVar102,auVar108,auVar112);
          auVar102 = vfmadd231ps_avx512vl(auVar103,auVar108,local_6e0);
          auVar109 = vfmadd231ps_avx512vl(auVar109,local_3e0,auVar108);
          auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar106,auVar103);
          vandps_avx512vl(auVar105,auVar103);
          auVar108 = vmaxps_avx(auVar103,auVar103);
          vandps_avx512vl(auVar104,auVar103);
          auVar108 = vmaxps_avx(auVar108,auVar103);
          uVar62 = vcmpps_avx512vl(auVar108,local_740,1);
          bVar12 = (bool)((byte)uVar62 & 1);
          auVar120._0_4_ = (float)((uint)bVar12 * auVar96._0_4_ | (uint)!bVar12 * auVar106._0_4_);
          bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar106._4_4_);
          bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar106._8_4_);
          bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar106._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar120._16_4_ = (float)((uint)bVar12 * auVar96._16_4_ | (uint)!bVar12 * auVar106._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar120._20_4_ = (float)((uint)bVar12 * auVar96._20_4_ | (uint)!bVar12 * auVar106._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar120._24_4_ = (float)((uint)bVar12 * auVar96._24_4_ | (uint)!bVar12 * auVar106._24_4_)
          ;
          bVar12 = SUB81(uVar62 >> 7,0);
          auVar120._28_4_ = (uint)bVar12 * auVar96._28_4_ | (uint)!bVar12 * auVar106._28_4_;
          bVar12 = (bool)((byte)uVar62 & 1);
          auVar121._0_4_ = (float)((uint)bVar12 * auVar97._0_4_ | (uint)!bVar12 * auVar105._0_4_);
          bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar105._4_4_);
          bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar105._8_4_);
          bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar105._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar121._16_4_ = (float)((uint)bVar12 * auVar97._16_4_ | (uint)!bVar12 * auVar105._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar121._20_4_ = (float)((uint)bVar12 * auVar97._20_4_ | (uint)!bVar12 * auVar105._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar121._24_4_ = (float)((uint)bVar12 * auVar97._24_4_ | (uint)!bVar12 * auVar105._24_4_)
          ;
          bVar12 = SUB81(uVar62 >> 7,0);
          auVar121._28_4_ = (uint)bVar12 * auVar97._28_4_ | (uint)!bVar12 * auVar105._28_4_;
          vandps_avx512vl(auVar107,auVar103);
          vandps_avx512vl(auVar102,auVar103);
          auVar108 = vmaxps_avx(auVar121,auVar121);
          vandps_avx512vl(auVar109,auVar103);
          auVar108 = vmaxps_avx(auVar108,auVar121);
          uVar62 = vcmpps_avx512vl(auVar108,local_740,1);
          bVar12 = (bool)((byte)uVar62 & 1);
          auVar122._0_4_ = (uint)bVar12 * auVar96._0_4_ | (uint)!bVar12 * auVar107._0_4_;
          bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar107._4_4_;
          bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar107._8_4_;
          bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar107._12_4_;
          bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar122._16_4_ = (uint)bVar12 * auVar96._16_4_ | (uint)!bVar12 * auVar107._16_4_;
          bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar122._20_4_ = (uint)bVar12 * auVar96._20_4_ | (uint)!bVar12 * auVar107._20_4_;
          bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar122._24_4_ = (uint)bVar12 * auVar96._24_4_ | (uint)!bVar12 * auVar107._24_4_;
          bVar12 = SUB81(uVar62 >> 7,0);
          auVar122._28_4_ = (uint)bVar12 * auVar96._28_4_ | (uint)!bVar12 * auVar107._28_4_;
          bVar12 = (bool)((byte)uVar62 & 1);
          auVar123._0_4_ = (float)((uint)bVar12 * auVar97._0_4_ | (uint)!bVar12 * auVar102._0_4_);
          bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar102._4_4_);
          bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar102._8_4_);
          bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar102._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
          auVar123._16_4_ = (float)((uint)bVar12 * auVar97._16_4_ | (uint)!bVar12 * auVar102._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
          auVar123._20_4_ = (float)((uint)bVar12 * auVar97._20_4_ | (uint)!bVar12 * auVar102._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
          auVar123._24_4_ = (float)((uint)bVar12 * auVar97._24_4_ | (uint)!bVar12 * auVar102._24_4_)
          ;
          bVar12 = SUB81(uVar62 >> 7,0);
          auVar123._28_4_ = (uint)bVar12 * auVar97._28_4_ | (uint)!bVar12 * auVar102._28_4_;
          auVar180._8_4_ = 0x80000000;
          auVar180._0_8_ = 0x8000000080000000;
          auVar180._12_4_ = 0x80000000;
          auVar180._16_4_ = 0x80000000;
          auVar180._20_4_ = 0x80000000;
          auVar180._24_4_ = 0x80000000;
          auVar180._28_4_ = 0x80000000;
          auVar108 = vxorps_avx512vl(auVar122,auVar180);
          auVar102 = auVar194._0_32_;
          auVar109 = vfmadd213ps_avx512vl(auVar120,auVar120,auVar102);
          auVar89 = vfmadd231ps_fma(auVar109,auVar121,auVar121);
          auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
          auVar191._8_4_ = 0xbf000000;
          auVar191._0_8_ = 0xbf000000bf000000;
          auVar191._12_4_ = 0xbf000000;
          auVar191._16_4_ = 0xbf000000;
          auVar191._20_4_ = 0xbf000000;
          auVar191._24_4_ = 0xbf000000;
          auVar191._28_4_ = 0xbf000000;
          fVar157 = auVar109._0_4_;
          fVar175 = auVar109._4_4_;
          fVar178 = auVar109._8_4_;
          fVar147 = auVar109._12_4_;
          fVar171 = auVar109._16_4_;
          fVar170 = auVar109._20_4_;
          fVar173 = auVar109._24_4_;
          auVar44._4_4_ = fVar175 * fVar175 * fVar175 * auVar89._4_4_ * -0.5;
          auVar44._0_4_ = fVar157 * fVar157 * fVar157 * auVar89._0_4_ * -0.5;
          auVar44._8_4_ = fVar178 * fVar178 * fVar178 * auVar89._8_4_ * -0.5;
          auVar44._12_4_ = fVar147 * fVar147 * fVar147 * auVar89._12_4_ * -0.5;
          auVar44._16_4_ = fVar171 * fVar171 * fVar171 * -0.0;
          auVar44._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
          auVar44._24_4_ = fVar173 * fVar173 * fVar173 * -0.0;
          auVar44._28_4_ = auVar121._28_4_;
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar109 = vfmadd231ps_avx512vl(auVar44,auVar107,auVar109);
          auVar45._4_4_ = auVar121._4_4_ * auVar109._4_4_;
          auVar45._0_4_ = auVar121._0_4_ * auVar109._0_4_;
          auVar45._8_4_ = auVar121._8_4_ * auVar109._8_4_;
          auVar45._12_4_ = auVar121._12_4_ * auVar109._12_4_;
          auVar45._16_4_ = auVar121._16_4_ * auVar109._16_4_;
          auVar45._20_4_ = auVar121._20_4_ * auVar109._20_4_;
          auVar45._24_4_ = auVar121._24_4_ * auVar109._24_4_;
          auVar45._28_4_ = 0;
          auVar46._4_4_ = auVar109._4_4_ * -auVar120._4_4_;
          auVar46._0_4_ = auVar109._0_4_ * -auVar120._0_4_;
          auVar46._8_4_ = auVar109._8_4_ * -auVar120._8_4_;
          auVar46._12_4_ = auVar109._12_4_ * -auVar120._12_4_;
          auVar46._16_4_ = auVar109._16_4_ * -auVar120._16_4_;
          auVar46._20_4_ = auVar109._20_4_ * -auVar120._20_4_;
          auVar46._24_4_ = auVar109._24_4_ * -auVar120._24_4_;
          auVar46._28_4_ = auVar121._28_4_;
          auVar106 = vmulps_avx512vl(auVar109,auVar102);
          auVar109 = vfmadd213ps_avx512vl(auVar122,auVar122,auVar102);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar123,auVar123);
          auVar105 = vrsqrt14ps_avx512vl(auVar109);
          auVar109 = vmulps_avx512vl(auVar109,auVar191);
          fVar157 = auVar105._0_4_;
          fVar175 = auVar105._4_4_;
          fVar178 = auVar105._8_4_;
          fVar147 = auVar105._12_4_;
          fVar171 = auVar105._16_4_;
          fVar170 = auVar105._20_4_;
          fVar173 = auVar105._24_4_;
          auVar47._4_4_ = fVar175 * fVar175 * fVar175 * auVar109._4_4_;
          auVar47._0_4_ = fVar157 * fVar157 * fVar157 * auVar109._0_4_;
          auVar47._8_4_ = fVar178 * fVar178 * fVar178 * auVar109._8_4_;
          auVar47._12_4_ = fVar147 * fVar147 * fVar147 * auVar109._12_4_;
          auVar47._16_4_ = fVar171 * fVar171 * fVar171 * auVar109._16_4_;
          auVar47._20_4_ = fVar170 * fVar170 * fVar170 * auVar109._20_4_;
          auVar47._24_4_ = fVar173 * fVar173 * fVar173 * auVar109._24_4_;
          auVar47._28_4_ = auVar109._28_4_;
          auVar109 = vfmadd231ps_avx512vl(auVar47,auVar107,auVar105);
          auVar48._4_4_ = auVar123._4_4_ * auVar109._4_4_;
          auVar48._0_4_ = auVar123._0_4_ * auVar109._0_4_;
          auVar48._8_4_ = auVar123._8_4_ * auVar109._8_4_;
          auVar48._12_4_ = auVar123._12_4_ * auVar109._12_4_;
          auVar48._16_4_ = auVar123._16_4_ * auVar109._16_4_;
          auVar48._20_4_ = auVar123._20_4_ * auVar109._20_4_;
          auVar48._24_4_ = auVar123._24_4_ * auVar109._24_4_;
          auVar48._28_4_ = auVar105._28_4_;
          auVar49._4_4_ = auVar109._4_4_ * auVar108._4_4_;
          auVar49._0_4_ = auVar109._0_4_ * auVar108._0_4_;
          auVar49._8_4_ = auVar109._8_4_ * auVar108._8_4_;
          auVar49._12_4_ = auVar109._12_4_ * auVar108._12_4_;
          auVar49._16_4_ = auVar109._16_4_ * auVar108._16_4_;
          auVar49._20_4_ = auVar109._20_4_ * auVar108._20_4_;
          auVar49._24_4_ = auVar109._24_4_ * auVar108._24_4_;
          auVar49._28_4_ = auVar108._28_4_;
          auVar108 = vmulps_avx512vl(auVar109,auVar102);
          auVar89 = vfmadd213ps_fma(auVar45,ZEXT1632(auVar87),auVar98);
          auVar109 = ZEXT1632(auVar87);
          auVar88 = vfmadd213ps_fma(auVar46,auVar109,auVar99);
          auVar107 = vfmadd213ps_avx512vl(auVar106,auVar109,auVar95);
          auVar105 = vfmadd213ps_avx512vl(auVar48,ZEXT1632(auVar92),auVar100);
          auVar81 = vfnmadd213ps_fma(auVar45,auVar109,auVar98);
          auVar104 = ZEXT1632(auVar92);
          auVar27 = vfmadd213ps_fma(auVar49,auVar104,auVar101);
          auVar82 = vfnmadd213ps_fma(auVar46,auVar109,auVar99);
          auVar83 = vfmadd213ps_fma(auVar108,auVar104,auVar94);
          auVar99 = ZEXT1632(auVar87);
          auVar86 = vfnmadd231ps_fma(auVar95,auVar99,auVar106);
          auVar84 = vfnmadd213ps_fma(auVar48,auVar104,auVar100);
          auVar85 = vfnmadd213ps_fma(auVar49,auVar104,auVar101);
          auVar93 = vfnmadd231ps_fma(auVar94,ZEXT1632(auVar92),auVar108);
          auVar94 = vsubps_avx512vl(auVar105,ZEXT1632(auVar81));
          auVar108 = vsubps_avx(ZEXT1632(auVar27),ZEXT1632(auVar82));
          auVar109 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar86));
          auVar50._4_4_ = auVar108._4_4_ * auVar86._4_4_;
          auVar50._0_4_ = auVar108._0_4_ * auVar86._0_4_;
          auVar50._8_4_ = auVar108._8_4_ * auVar86._8_4_;
          auVar50._12_4_ = auVar108._12_4_ * auVar86._12_4_;
          auVar50._16_4_ = auVar108._16_4_ * 0.0;
          auVar50._20_4_ = auVar108._20_4_ * 0.0;
          auVar50._24_4_ = auVar108._24_4_ * 0.0;
          auVar50._28_4_ = auVar106._28_4_;
          auVar87 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar82),auVar109);
          auVar51._4_4_ = auVar109._4_4_ * auVar81._4_4_;
          auVar51._0_4_ = auVar109._0_4_ * auVar81._0_4_;
          auVar51._8_4_ = auVar109._8_4_ * auVar81._8_4_;
          auVar51._12_4_ = auVar109._12_4_ * auVar81._12_4_;
          auVar51._16_4_ = auVar109._16_4_ * 0.0;
          auVar51._20_4_ = auVar109._20_4_ * 0.0;
          auVar51._24_4_ = auVar109._24_4_ * 0.0;
          auVar51._28_4_ = auVar109._28_4_;
          auVar79 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar86),auVar94);
          auVar52._4_4_ = auVar82._4_4_ * auVar94._4_4_;
          auVar52._0_4_ = auVar82._0_4_ * auVar94._0_4_;
          auVar52._8_4_ = auVar82._8_4_ * auVar94._8_4_;
          auVar52._12_4_ = auVar82._12_4_ * auVar94._12_4_;
          auVar52._16_4_ = auVar94._16_4_ * 0.0;
          auVar52._20_4_ = auVar94._20_4_ * 0.0;
          auVar52._24_4_ = auVar94._24_4_ * 0.0;
          auVar52._28_4_ = auVar94._28_4_;
          auVar80 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar81),auVar108);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar102,ZEXT1632(auVar79));
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar102,ZEXT1632(auVar87));
          uVar62 = vcmpps_avx512vl(auVar108,auVar102,2);
          bVar61 = (byte)uVar62;
          fVar132 = (float)((uint)(bVar61 & 1) * auVar89._0_4_ |
                           (uint)!(bool)(bVar61 & 1) * auVar84._0_4_);
          bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
          fVar134 = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar84._4_4_);
          bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
          fVar136 = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar84._8_4_);
          bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
          fVar138 = (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar84._12_4_);
          auVar104 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar136,CONCAT44(fVar134,fVar132))));
          fVar133 = (float)((uint)(bVar61 & 1) * auVar88._0_4_ |
                           (uint)!(bool)(bVar61 & 1) * auVar85._0_4_);
          bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
          fVar135 = (float)((uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar85._4_4_);
          bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
          fVar137 = (float)((uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar85._8_4_);
          bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
          fVar139 = (float)((uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar85._12_4_);
          auVar96 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar137,CONCAT44(fVar135,fVar133))));
          auVar124._0_4_ =
               (float)((uint)(bVar61 & 1) * auVar107._0_4_ |
                      (uint)!(bool)(bVar61 & 1) * auVar93._0_4_);
          bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * auVar93._4_4_);
          bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * auVar93._8_4_);
          bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * auVar93._12_4_)
          ;
          fVar178 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar107._16_4_);
          auVar124._16_4_ = fVar178;
          fVar175 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar107._20_4_);
          auVar124._20_4_ = fVar175;
          fVar157 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar107._24_4_);
          auVar124._24_4_ = fVar157;
          iVar1 = (uint)(byte)(uVar62 >> 7) * auVar107._28_4_;
          auVar124._28_4_ = iVar1;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar81),auVar105);
          auVar125._0_4_ =
               (uint)(bVar61 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar87._0_4_;
          bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar87._4_4_;
          bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar87._8_4_;
          bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar87._12_4_;
          auVar125._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar108._16_4_;
          auVar125._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar108._20_4_;
          auVar125._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar108._24_4_;
          auVar125._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar108._28_4_;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar27));
          auVar126._0_4_ =
               (float)((uint)(bVar61 & 1) * auVar108._0_4_ |
                      (uint)!(bool)(bVar61 & 1) * auVar89._0_4_);
          bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar89._4_4_);
          bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar89._8_4_);
          bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar89._12_4_)
          ;
          fVar147 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar108._16_4_);
          auVar126._16_4_ = fVar147;
          fVar171 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar108._20_4_);
          auVar126._20_4_ = fVar171;
          fVar170 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar108._24_4_);
          auVar126._24_4_ = fVar170;
          auVar126._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar108._28_4_;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar83));
          auVar127._0_4_ =
               (float)((uint)(bVar61 & 1) * auVar108._0_4_ |
                      (uint)!(bool)(bVar61 & 1) * auVar88._0_4_);
          bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar88._4_4_);
          bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar88._8_4_);
          bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar88._12_4_)
          ;
          fVar72 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar108._16_4_);
          auVar127._16_4_ = fVar72;
          fVar73 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar108._20_4_);
          auVar127._20_4_ = fVar73;
          fVar173 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar108._24_4_);
          auVar127._24_4_ = fVar173;
          iVar2 = (uint)(byte)(uVar62 >> 7) * auVar108._28_4_;
          auVar127._28_4_ = iVar2;
          auVar128._0_4_ =
               (uint)(bVar61 & 1) * (int)auVar81._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar105._0_4_;
          bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar12 * (int)auVar81._4_4_ | (uint)!bVar12 * auVar105._4_4_;
          bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar12 * (int)auVar81._8_4_ | (uint)!bVar12 * auVar105._8_4_;
          bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar12 * (int)auVar81._12_4_ | (uint)!bVar12 * auVar105._12_4_;
          auVar128._16_4_ = (uint)!(bool)((byte)(uVar62 >> 4) & 1) * auVar105._16_4_;
          auVar128._20_4_ = (uint)!(bool)((byte)(uVar62 >> 5) & 1) * auVar105._20_4_;
          auVar128._24_4_ = (uint)!(bool)((byte)(uVar62 >> 6) & 1) * auVar105._24_4_;
          auVar128._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar105._28_4_;
          bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar62 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar62 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar62 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar62 >> 3) & 1);
          auVar105 = vsubps_avx512vl(auVar128,auVar104);
          auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar82._12_4_ |
                                                   (uint)!bVar16 * auVar27._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar82._8_4_ |
                                                            (uint)!bVar14 * auVar27._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar82._4_4_ |
                                                                     (uint)!bVar12 * auVar27._4_4_,
                                                                     (uint)(bVar61 & 1) *
                                                                     (int)auVar82._0_4_ |
                                                                     (uint)!(bool)(bVar61 & 1) *
                                                                     auVar27._0_4_)))),auVar96);
          auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar86._12_4_ |
                                                   (uint)!bVar17 * auVar83._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar86._8_4_ |
                                                            (uint)!bVar15 * auVar83._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar86._4_4_ |
                                                                     (uint)!bVar13 * auVar83._4_4_,
                                                                     (uint)(bVar61 & 1) *
                                                                     (int)auVar86._0_4_ |
                                                                     (uint)!(bool)(bVar61 & 1) *
                                                                     auVar83._0_4_)))),auVar124);
          auVar106 = vsubps_avx(auVar104,auVar125);
          auVar94 = vsubps_avx(auVar96,auVar126);
          auVar95 = vsubps_avx(auVar124,auVar127);
          auVar53._4_4_ = auVar107._4_4_ * fVar134;
          auVar53._0_4_ = auVar107._0_4_ * fVar132;
          auVar53._8_4_ = auVar107._8_4_ * fVar136;
          auVar53._12_4_ = auVar107._12_4_ * fVar138;
          auVar53._16_4_ = auVar107._16_4_ * 0.0;
          auVar53._20_4_ = auVar107._20_4_ * 0.0;
          auVar53._24_4_ = auVar107._24_4_ * 0.0;
          auVar53._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar53,auVar124,auVar105);
          auVar161._0_4_ = fVar133 * auVar105._0_4_;
          auVar161._4_4_ = fVar135 * auVar105._4_4_;
          auVar161._8_4_ = fVar137 * auVar105._8_4_;
          auVar161._12_4_ = fVar139 * auVar105._12_4_;
          auVar161._16_4_ = auVar105._16_4_ * 0.0;
          auVar161._20_4_ = auVar105._20_4_ * 0.0;
          auVar161._24_4_ = auVar105._24_4_ * 0.0;
          auVar161._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar161,auVar104,auVar109);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar102,ZEXT1632(auVar87));
          auVar166._0_4_ = auVar109._0_4_ * auVar124._0_4_;
          auVar166._4_4_ = auVar109._4_4_ * auVar124._4_4_;
          auVar166._8_4_ = auVar109._8_4_ * auVar124._8_4_;
          auVar166._12_4_ = auVar109._12_4_ * auVar124._12_4_;
          auVar166._16_4_ = auVar109._16_4_ * fVar178;
          auVar166._20_4_ = auVar109._20_4_ * fVar175;
          auVar166._24_4_ = auVar109._24_4_ * fVar157;
          auVar166._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar166,auVar96,auVar107);
          auVar97 = vfmadd231ps_avx512vl(auVar108,auVar102,ZEXT1632(auVar87));
          auVar108 = vmulps_avx512vl(auVar95,auVar125);
          auVar108 = vfmsub231ps_avx512vl(auVar108,auVar106,auVar127);
          auVar54._4_4_ = auVar94._4_4_ * auVar127._4_4_;
          auVar54._0_4_ = auVar94._0_4_ * auVar127._0_4_;
          auVar54._8_4_ = auVar94._8_4_ * auVar127._8_4_;
          auVar54._12_4_ = auVar94._12_4_ * auVar127._12_4_;
          auVar54._16_4_ = auVar94._16_4_ * fVar72;
          auVar54._20_4_ = auVar94._20_4_ * fVar73;
          auVar54._24_4_ = auVar94._24_4_ * fVar173;
          auVar54._28_4_ = iVar2;
          auVar87 = vfmsub231ps_fma(auVar54,auVar126,auVar95);
          auVar167._0_4_ = auVar126._0_4_ * auVar106._0_4_;
          auVar167._4_4_ = auVar126._4_4_ * auVar106._4_4_;
          auVar167._8_4_ = auVar126._8_4_ * auVar106._8_4_;
          auVar167._12_4_ = auVar126._12_4_ * auVar106._12_4_;
          auVar167._16_4_ = fVar147 * auVar106._16_4_;
          auVar167._20_4_ = fVar171 * auVar106._20_4_;
          auVar167._24_4_ = fVar170 * auVar106._24_4_;
          auVar167._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar167,auVar94,auVar125);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar102,auVar108);
          auVar98 = vfmadd231ps_avx512vl(auVar108,auVar102,ZEXT1632(auVar87));
          auVar108 = vmaxps_avx(auVar97,auVar98);
          uVar148 = vcmpps_avx512vl(auVar108,auVar102,2);
          bVar71 = bVar71 & (byte)uVar148;
          if (bVar71 != 0) {
            auVar55._4_4_ = auVar95._4_4_ * auVar109._4_4_;
            auVar55._0_4_ = auVar95._0_4_ * auVar109._0_4_;
            auVar55._8_4_ = auVar95._8_4_ * auVar109._8_4_;
            auVar55._12_4_ = auVar95._12_4_ * auVar109._12_4_;
            auVar55._16_4_ = auVar95._16_4_ * auVar109._16_4_;
            auVar55._20_4_ = auVar95._20_4_ * auVar109._20_4_;
            auVar55._24_4_ = auVar95._24_4_ * auVar109._24_4_;
            auVar55._28_4_ = auVar108._28_4_;
            auVar88 = vfmsub231ps_fma(auVar55,auVar94,auVar107);
            auVar56._4_4_ = auVar107._4_4_ * auVar106._4_4_;
            auVar56._0_4_ = auVar107._0_4_ * auVar106._0_4_;
            auVar56._8_4_ = auVar107._8_4_ * auVar106._8_4_;
            auVar56._12_4_ = auVar107._12_4_ * auVar106._12_4_;
            auVar56._16_4_ = auVar107._16_4_ * auVar106._16_4_;
            auVar56._20_4_ = auVar107._20_4_ * auVar106._20_4_;
            auVar56._24_4_ = auVar107._24_4_ * auVar106._24_4_;
            auVar56._28_4_ = auVar107._28_4_;
            auVar89 = vfmsub231ps_fma(auVar56,auVar105,auVar95);
            auVar57._4_4_ = auVar94._4_4_ * auVar105._4_4_;
            auVar57._0_4_ = auVar94._0_4_ * auVar105._0_4_;
            auVar57._8_4_ = auVar94._8_4_ * auVar105._8_4_;
            auVar57._12_4_ = auVar94._12_4_ * auVar105._12_4_;
            auVar57._16_4_ = auVar94._16_4_ * auVar105._16_4_;
            auVar57._20_4_ = auVar94._20_4_ * auVar105._20_4_;
            auVar57._24_4_ = auVar94._24_4_ * auVar105._24_4_;
            auVar57._28_4_ = auVar94._28_4_;
            auVar27 = vfmsub231ps_fma(auVar57,auVar106,auVar109);
            auVar87 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar27));
            auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar88),auVar102);
            auVar109 = vrcp14ps_avx512vl(auVar108);
            auVar106 = auVar193._0_32_;
            auVar107 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar106);
            auVar87 = vfmadd132ps_fma(auVar107,auVar109,auVar109);
            auVar58._4_4_ = auVar27._4_4_ * auVar124._4_4_;
            auVar58._0_4_ = auVar27._0_4_ * auVar124._0_4_;
            auVar58._8_4_ = auVar27._8_4_ * auVar124._8_4_;
            auVar58._12_4_ = auVar27._12_4_ * auVar124._12_4_;
            auVar58._16_4_ = fVar178 * 0.0;
            auVar58._20_4_ = fVar175 * 0.0;
            auVar58._24_4_ = fVar157 * 0.0;
            auVar58._28_4_ = iVar1;
            auVar89 = vfmadd231ps_fma(auVar58,auVar96,ZEXT1632(auVar89));
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar104,ZEXT1632(auVar88));
            fVar157 = auVar87._0_4_;
            fVar175 = auVar87._4_4_;
            fVar178 = auVar87._8_4_;
            fVar147 = auVar87._12_4_;
            local_5a0 = ZEXT1632(CONCAT412(auVar89._12_4_ * fVar147,
                                           CONCAT48(auVar89._8_4_ * fVar178,
                                                    CONCAT44(auVar89._4_4_ * fVar175,
                                                             auVar89._0_4_ * fVar157))));
            auVar60._4_4_ = uStack_65c;
            auVar60._0_4_ = local_660;
            auVar60._8_4_ = uStack_658;
            auVar60._12_4_ = uStack_654;
            auVar60._16_4_ = uStack_650;
            auVar60._20_4_ = uStack_64c;
            auVar60._24_4_ = uStack_648;
            auVar60._28_4_ = uStack_644;
            uVar148 = vcmpps_avx512vl(local_5a0,auVar60,0xd);
            uVar140 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar34._4_4_ = uVar140;
            auVar34._0_4_ = uVar140;
            auVar34._8_4_ = uVar140;
            auVar34._12_4_ = uVar140;
            auVar34._16_4_ = uVar140;
            auVar34._20_4_ = uVar140;
            auVar34._24_4_ = uVar140;
            auVar34._28_4_ = uVar140;
            uVar30 = vcmpps_avx512vl(local_5a0,auVar34,2);
            bVar71 = (byte)uVar148 & (byte)uVar30 & bVar71;
            if (bVar71 != 0) {
              uVar148 = vcmpps_avx512vl(auVar108,auVar102,4);
              bVar71 = bVar71 & (byte)uVar148;
              auVar192 = ZEXT3264(local_840);
              auVar146 = ZEXT3264(local_860);
              if (bVar71 != 0) {
                fVar171 = auVar97._0_4_ * fVar157;
                fVar170 = auVar97._4_4_ * fVar175;
                auVar59._4_4_ = fVar170;
                auVar59._0_4_ = fVar171;
                fVar173 = auVar97._8_4_ * fVar178;
                auVar59._8_4_ = fVar173;
                fVar72 = auVar97._12_4_ * fVar147;
                auVar59._12_4_ = fVar72;
                fVar73 = auVar97._16_4_ * 0.0;
                auVar59._16_4_ = fVar73;
                fVar132 = auVar97._20_4_ * 0.0;
                auVar59._20_4_ = fVar132;
                fVar133 = auVar97._24_4_ * 0.0;
                auVar59._24_4_ = fVar133;
                auVar59._28_4_ = auVar108._28_4_;
                auVar109 = vsubps_avx512vl(auVar106,auVar59);
                local_5e0._0_4_ =
                     (float)((uint)(bVar61 & 1) * (int)fVar171 |
                            (uint)!(bool)(bVar61 & 1) * auVar109._0_4_);
                bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
                local_5e0._4_4_ =
                     (float)((uint)bVar12 * (int)fVar170 | (uint)!bVar12 * auVar109._4_4_);
                bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
                local_5e0._8_4_ =
                     (float)((uint)bVar12 * (int)fVar173 | (uint)!bVar12 * auVar109._8_4_);
                bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
                local_5e0._12_4_ =
                     (float)((uint)bVar12 * (int)fVar72 | (uint)!bVar12 * auVar109._12_4_);
                bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
                local_5e0._16_4_ =
                     (float)((uint)bVar12 * (int)fVar73 | (uint)!bVar12 * auVar109._16_4_);
                bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
                local_5e0._20_4_ =
                     (float)((uint)bVar12 * (int)fVar132 | (uint)!bVar12 * auVar109._20_4_);
                bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
                local_5e0._24_4_ =
                     (float)((uint)bVar12 * (int)fVar133 | (uint)!bVar12 * auVar109._24_4_);
                bVar12 = SUB81(uVar62 >> 7,0);
                local_5e0._28_4_ =
                     (float)((uint)bVar12 * auVar108._28_4_ | (uint)!bVar12 * auVar109._28_4_);
                auVar108 = vsubps_avx(ZEXT1632(auVar92),auVar99);
                auVar87 = vfmadd213ps_fma(auVar108,local_5e0,auVar99);
                uVar140 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar35._4_4_ = uVar140;
                auVar35._0_4_ = uVar140;
                auVar35._8_4_ = uVar140;
                auVar35._12_4_ = uVar140;
                auVar35._16_4_ = uVar140;
                auVar35._20_4_ = uVar140;
                auVar35._24_4_ = uVar140;
                auVar35._28_4_ = uVar140;
                auVar108 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar87._12_4_ + auVar87._12_4_,
                                                              CONCAT48(auVar87._8_4_ + auVar87._8_4_
                                                                       ,CONCAT44(auVar87._4_4_ +
                                                                                 auVar87._4_4_,
                                                                                 auVar87._0_4_ +
                                                                                 auVar87._0_4_)))),
                                           auVar35);
                uVar148 = vcmpps_avx512vl(local_5a0,auVar108,6);
                if (((byte)uVar148 & bVar71) != 0) {
                  auVar152._0_4_ = auVar98._0_4_ * fVar157;
                  auVar152._4_4_ = auVar98._4_4_ * fVar175;
                  auVar152._8_4_ = auVar98._8_4_ * fVar178;
                  auVar152._12_4_ = auVar98._12_4_ * fVar147;
                  auVar152._16_4_ = auVar98._16_4_ * 0.0;
                  auVar152._20_4_ = auVar98._20_4_ * 0.0;
                  auVar152._24_4_ = auVar98._24_4_ * 0.0;
                  auVar152._28_4_ = 0;
                  auVar108 = vsubps_avx512vl(auVar106,auVar152);
                  auVar129._0_4_ =
                       (uint)(bVar61 & 1) * (int)auVar152._0_4_ |
                       (uint)!(bool)(bVar61 & 1) * auVar108._0_4_;
                  bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
                  auVar129._4_4_ =
                       (uint)bVar12 * (int)auVar152._4_4_ | (uint)!bVar12 * auVar108._4_4_;
                  bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
                  auVar129._8_4_ =
                       (uint)bVar12 * (int)auVar152._8_4_ | (uint)!bVar12 * auVar108._8_4_;
                  bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
                  auVar129._12_4_ =
                       (uint)bVar12 * (int)auVar152._12_4_ | (uint)!bVar12 * auVar108._12_4_;
                  bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
                  auVar129._16_4_ =
                       (uint)bVar12 * (int)auVar152._16_4_ | (uint)!bVar12 * auVar108._16_4_;
                  bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
                  auVar129._20_4_ =
                       (uint)bVar12 * (int)auVar152._20_4_ | (uint)!bVar12 * auVar108._20_4_;
                  bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
                  auVar129._24_4_ =
                       (uint)bVar12 * (int)auVar152._24_4_ | (uint)!bVar12 * auVar108._24_4_;
                  auVar129._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar108._28_4_;
                  auVar36._8_4_ = 0x40000000;
                  auVar36._0_8_ = 0x4000000040000000;
                  auVar36._12_4_ = 0x40000000;
                  auVar36._16_4_ = 0x40000000;
                  auVar36._20_4_ = 0x40000000;
                  auVar36._24_4_ = 0x40000000;
                  auVar36._28_4_ = 0x40000000;
                  local_5c0 = vfmsub132ps_avx512vl(auVar129,auVar106,auVar36);
                  local_580 = (undefined4)lVar63;
                  local_570 = local_7f0._0_8_;
                  uStack_568 = local_7f0._8_8_;
                  local_560 = local_800._0_8_;
                  uStack_558 = local_800._8_8_;
                  local_550 = local_810._0_8_;
                  uStack_548 = local_810._8_8_;
                  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                    bVar61 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar61 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar87 = vcvtsi2ss_avx512f(auVar193._0_16_,local_580);
                    fVar157 = auVar87._0_4_;
                    local_520[0] = (fVar157 + local_5e0._0_4_ + 0.0) * (float)local_680._0_4_;
                    local_520[1] = (fVar157 + local_5e0._4_4_ + 1.0) * (float)local_680._4_4_;
                    local_520[2] = (fVar157 + local_5e0._8_4_ + 2.0) * fStack_678;
                    local_520[3] = (fVar157 + local_5e0._12_4_ + 3.0) * fStack_674;
                    fStack_510 = (fVar157 + local_5e0._16_4_ + 4.0) * fStack_670;
                    fStack_50c = (fVar157 + local_5e0._20_4_ + 5.0) * fStack_66c;
                    fStack_508 = (fVar157 + local_5e0._24_4_ + 6.0) * fStack_668;
                    fStack_504 = fVar157 + local_5e0._28_4_ + 7.0;
                    local_500 = local_5c0;
                    local_4e0 = local_5a0;
                    uVar62 = 0;
                    uVar67 = (ulong)((byte)uVar148 & bVar71);
                    for (uVar65 = uVar67; local_57c = iVar7, (uVar65 & 1) == 0;
                        uVar65 = uVar65 >> 1 | 0x8000000000000000) {
                      uVar62 = uVar62 + 1;
                    }
                    while (auVar87 = auVar194._0_16_, uVar67 != 0) {
                      uVar140 = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar62]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar62 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar62 * 4)
                      ;
                      local_890.context = context->user;
                      fVar147 = local_200._0_4_;
                      fVar175 = 1.0 - fVar147;
                      fVar157 = fVar175 * fVar175 * -3.0;
                      auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar175 * fVar175)),
                                                ZEXT416((uint)(fVar147 * fVar175)),
                                                ZEXT416(0xc0000000));
                      auVar92 = vfmsub132ss_fma(ZEXT416((uint)(fVar147 * fVar175)),
                                                ZEXT416((uint)(fVar147 * fVar147)),
                                                ZEXT416(0x40000000));
                      fVar175 = auVar87._0_4_ * 3.0;
                      fVar178 = auVar92._0_4_ * 3.0;
                      fVar147 = fVar147 * fVar147 * 3.0;
                      auVar169._0_4_ = fVar147 * (float)local_690._0_4_;
                      auVar169._4_4_ = fVar147 * (float)local_690._4_4_;
                      auVar169._8_4_ = fVar147 * fStack_688;
                      auVar169._12_4_ = fVar147 * fStack_684;
                      auVar144._4_4_ = fVar178;
                      auVar144._0_4_ = fVar178;
                      auVar144._8_4_ = fVar178;
                      auVar144._12_4_ = fVar178;
                      auVar87 = vfmadd132ps_fma(auVar144,auVar169,local_810);
                      auVar159._4_4_ = fVar175;
                      auVar159._0_4_ = fVar175;
                      auVar159._8_4_ = fVar175;
                      auVar159._12_4_ = fVar175;
                      auVar87 = vfmadd132ps_fma(auVar159,auVar87,local_800);
                      auVar145._4_4_ = fVar157;
                      auVar145._0_4_ = fVar157;
                      auVar145._8_4_ = fVar157;
                      auVar145._12_4_ = fVar157;
                      auVar87 = vfmadd132ps_fma(auVar145,auVar87,local_7f0);
                      auVar146 = vbroadcastss_avx512f(auVar87);
                      auVar198 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar198,ZEXT1664(auVar87));
                      auVar198 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar198,ZEXT1664(auVar87));
                      local_2c0[0] = (RTCHitN)auVar146[0];
                      local_2c0[1] = (RTCHitN)auVar146[1];
                      local_2c0[2] = (RTCHitN)auVar146[2];
                      local_2c0[3] = (RTCHitN)auVar146[3];
                      local_2c0[4] = (RTCHitN)auVar146[4];
                      local_2c0[5] = (RTCHitN)auVar146[5];
                      local_2c0[6] = (RTCHitN)auVar146[6];
                      local_2c0[7] = (RTCHitN)auVar146[7];
                      local_2c0[8] = (RTCHitN)auVar146[8];
                      local_2c0[9] = (RTCHitN)auVar146[9];
                      local_2c0[10] = (RTCHitN)auVar146[10];
                      local_2c0[0xb] = (RTCHitN)auVar146[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar146[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar146[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar146[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar146[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar146[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar146[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar146[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar146[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar146[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar146[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar146[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar146[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar146[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar146[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar146[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar146[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar146[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar146[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar146[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar146[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar146[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar146[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar146[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar146[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar146[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar146[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar146[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar146[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar146[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar146[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar146[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar146[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar146[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar146[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar146[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar146[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar146[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar146[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar146[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar146[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar146[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar146[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar146[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar146[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar146[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar146[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar146[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar146[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar146[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar146[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar146[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar146[0x3f];
                      local_180 = local_300._0_8_;
                      uStack_178 = local_300._8_8_;
                      uStack_170 = local_300._16_8_;
                      uStack_168 = local_300._24_8_;
                      uStack_160 = local_300._32_8_;
                      uStack_158 = local_300._40_8_;
                      uStack_150 = local_300._48_8_;
                      uStack_148 = local_300._56_8_;
                      auVar146 = vmovdqa64_avx512f(local_480);
                      local_140 = vmovdqa64_avx512f(auVar146);
                      vpcmpeqd_avx2(auVar146._0_32_,auVar146._0_32_);
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_890.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_890.context)->instPrimID[0]));
                      auVar146 = vmovdqa64_avx512f(local_340);
                      local_640 = vmovdqa64_avx512f(auVar146);
                      local_890.valid = (int *)local_640;
                      local_890.geometryUserPtr = pGVar8->userPtr;
                      local_890.hit = local_2c0;
                      local_890.N = 0x10;
                      local_4c0._0_8_ = uVar62;
                      uVar65 = uVar62;
                      local_890.ray = (RTCRayN *)ray;
                      if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar8->occlusionFilterN)(&local_890);
                        auVar146 = vmovdqa64_avx512f(local_640);
                        uVar65 = local_4c0._0_8_;
                      }
                      uVar148 = vptestmd_avx512f(auVar146,auVar146);
                      if ((short)uVar148 != 0) {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var11)(&local_890);
                          auVar146 = vmovdqa64_avx512f(local_640);
                          uVar65 = local_4c0._0_8_;
                        }
                        auVar87 = auVar194._0_16_;
                        uVar62 = vptestmd_avx512f(auVar146,auVar146);
                        auVar198 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar12 = (bool)((byte)uVar62 & 1);
                        auVar146._0_4_ =
                             (uint)bVar12 * auVar198._0_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x200);
                        bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
                        auVar146._4_4_ =
                             (uint)bVar12 * auVar198._4_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x204);
                        bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
                        auVar146._8_4_ =
                             (uint)bVar12 * auVar198._8_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x208);
                        bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
                        auVar146._12_4_ =
                             (uint)bVar12 * auVar198._12_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x20c);
                        bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
                        auVar146._16_4_ =
                             (uint)bVar12 * auVar198._16_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x210);
                        bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
                        auVar146._20_4_ =
                             (uint)bVar12 * auVar198._20_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x214);
                        bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
                        auVar146._24_4_ =
                             (uint)bVar12 * auVar198._24_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x218);
                        bVar12 = (bool)((byte)(uVar62 >> 7) & 1);
                        auVar146._28_4_ =
                             (uint)bVar12 * auVar198._28_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x21c);
                        bVar12 = (bool)((byte)(uVar62 >> 8) & 1);
                        auVar146._32_4_ =
                             (uint)bVar12 * auVar198._32_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x220);
                        bVar12 = (bool)((byte)(uVar62 >> 9) & 1);
                        auVar146._36_4_ =
                             (uint)bVar12 * auVar198._36_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x224);
                        bVar12 = (bool)((byte)(uVar62 >> 10) & 1);
                        auVar146._40_4_ =
                             (uint)bVar12 * auVar198._40_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x228);
                        bVar12 = (bool)((byte)(uVar62 >> 0xb) & 1);
                        auVar146._44_4_ =
                             (uint)bVar12 * auVar198._44_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x22c);
                        bVar12 = (bool)((byte)(uVar62 >> 0xc) & 1);
                        auVar146._48_4_ =
                             (uint)bVar12 * auVar198._48_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x230);
                        bVar12 = (bool)((byte)(uVar62 >> 0xd) & 1);
                        auVar146._52_4_ =
                             (uint)bVar12 * auVar198._52_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x234);
                        bVar12 = (bool)((byte)(uVar62 >> 0xe) & 1);
                        auVar146._56_4_ =
                             (uint)bVar12 * auVar198._56_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x238);
                        bVar12 = SUB81(uVar62 >> 0xf,0);
                        auVar146._60_4_ =
                             (uint)bVar12 * auVar198._60_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x23c);
                        *(undefined1 (*) [64])(local_890.ray + 0x200) = auVar146;
                        if ((short)uVar62 != 0) {
                          bVar61 = 1;
                          goto LAB_018b77e6;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x200) = uVar140;
                      uVar62 = 0;
                      uVar67 = uVar67 ^ 1L << (uVar65 & 0x3f);
                      for (uVar65 = uVar67; (uVar65 & 1) == 0;
                          uVar65 = uVar65 >> 1 | 0x8000000000000000) {
                        uVar62 = uVar62 + 1;
                      }
                    }
                    bVar61 = 0;
LAB_018b77e6:
                    auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar193 = ZEXT3264(auVar108);
                    auVar87 = vxorps_avx512vl(auVar87,auVar87);
                    auVar194 = ZEXT1664(auVar87);
                    auVar195 = ZEXT3264(local_700);
                    auVar196 = ZEXT3264(local_6e0);
                    auVar192 = ZEXT3264(local_840);
                    auVar146 = ZEXT3264(local_860);
                    auVar197 = ZEXT3264(local_7a0);
                    auVar199 = ZEXT3264(local_720);
                    auVar198 = ZEXT3264(local_7c0);
                    auVar200 = ZEXT3264(local_7e0);
                  }
                  bVar66 = (bool)(bVar66 | bVar61);
                }
              }
              goto LAB_018b77c5;
            }
          }
          auVar192 = ZEXT3264(local_840);
          auVar146 = ZEXT3264(local_860);
        }
LAB_018b77c5:
      }
    }
    if (bVar66) break;
    uVar140 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar31._4_4_ = uVar140;
    auVar31._0_4_ = uVar140;
    auVar31._8_4_ = uVar140;
    auVar31._12_4_ = uVar140;
    uVar148 = vcmpps_avx512vl(local_5f0,auVar31,2);
  }
  return uVar69 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }